

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [32];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [28];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  int iVar81;
  ulong uVar82;
  ulong uVar83;
  RTCIntersectArguments *pRVar84;
  ulong uVar85;
  uint uVar86;
  long lVar87;
  long lVar88;
  undefined4 uVar89;
  RTCFilterFunctionN p_Var90;
  undefined4 uVar91;
  undefined8 unaff_R13;
  long lVar92;
  undefined8 uVar93;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar94 [16];
  float fVar111;
  float fVar115;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar100 [32];
  undefined1 auVar98 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar99 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  float fVar183;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined4 uVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  RTCFilterFunctionNArguments args;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  LinearSpace3fa *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  int iStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar82 = (ulong)(byte)PVar7;
  fVar133 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar94._0_4_ = fVar133 * auVar11._0_4_;
  auVar94._4_4_ = fVar133 * auVar11._4_4_;
  auVar94._8_4_ = fVar133 * auVar11._8_4_;
  auVar94._12_4_ = fVar133 * auVar11._12_4_;
  auVar157._0_4_ = fVar133 * auVar12._0_4_;
  auVar157._4_4_ = fVar133 * auVar12._4_4_;
  auVar157._8_4_ = fVar133 * auVar12._8_4_;
  auVar157._12_4_ = fVar133 * auVar12._12_4_;
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x12 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x13 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar197 = ZEXT1664(auVar96);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x14 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar202._4_4_ = auVar157._0_4_;
  auVar202._0_4_ = auVar157._0_4_;
  auVar202._8_4_ = auVar157._0_4_;
  auVar202._12_4_ = auVar157._0_4_;
  auVar121 = vshufps_avx(auVar157,auVar157,0x55);
  auVar95 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar133 = auVar95._0_4_;
  auVar193._0_4_ = fVar133 * auVar14._0_4_;
  fVar111 = auVar95._4_4_;
  auVar193._4_4_ = fVar111 * auVar14._4_4_;
  fVar113 = auVar95._8_4_;
  auVar193._8_4_ = fVar113 * auVar14._8_4_;
  fVar115 = auVar95._12_4_;
  auVar193._12_4_ = fVar115 * auVar14._12_4_;
  auVar185._0_4_ = auVar17._0_4_ * fVar133;
  auVar185._4_4_ = auVar17._4_4_ * fVar111;
  auVar185._8_4_ = auVar17._8_4_ * fVar113;
  auVar185._12_4_ = auVar17._12_4_ * fVar115;
  auVar175._0_4_ = auVar134._0_4_ * fVar133;
  auVar175._4_4_ = auVar134._4_4_ * fVar111;
  auVar175._8_4_ = auVar134._8_4_ * fVar113;
  auVar175._12_4_ = auVar134._12_4_ * fVar115;
  auVar95 = vfmadd231ps_fma(auVar193,auVar121,auVar12);
  auVar122 = vfmadd231ps_fma(auVar185,auVar121,auVar16);
  auVar121 = vfmadd231ps_fma(auVar175,auVar96,auVar121);
  auVar146 = vfmadd231ps_fma(auVar95,auVar202,auVar11);
  auVar195 = ZEXT1664(auVar146);
  auVar122 = vfmadd231ps_fma(auVar122,auVar202,auVar15);
  auVar152 = vfmadd231ps_fma(auVar121,auVar97,auVar202);
  auVar203._4_4_ = auVar94._0_4_;
  auVar203._0_4_ = auVar94._0_4_;
  auVar203._8_4_ = auVar94._0_4_;
  auVar203._12_4_ = auVar94._0_4_;
  auVar121 = vshufps_avx(auVar94,auVar94,0x55);
  auVar95 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar133 = auVar95._0_4_;
  auVar158._0_4_ = fVar133 * auVar14._0_4_;
  fVar111 = auVar95._4_4_;
  auVar158._4_4_ = fVar111 * auVar14._4_4_;
  fVar113 = auVar95._8_4_;
  auVar158._8_4_ = fVar113 * auVar14._8_4_;
  fVar115 = auVar95._12_4_;
  auVar158._12_4_ = fVar115 * auVar14._12_4_;
  auVar120._0_4_ = auVar17._0_4_ * fVar133;
  auVar120._4_4_ = auVar17._4_4_ * fVar111;
  auVar120._8_4_ = auVar17._8_4_ * fVar113;
  auVar120._12_4_ = auVar17._12_4_ * fVar115;
  auVar95._0_4_ = auVar134._0_4_ * fVar133;
  auVar95._4_4_ = auVar134._4_4_ * fVar111;
  auVar95._8_4_ = auVar134._8_4_ * fVar113;
  auVar95._12_4_ = auVar134._12_4_ * fVar115;
  auVar12 = vfmadd231ps_fma(auVar158,auVar121,auVar12);
  auVar14 = vfmadd231ps_fma(auVar120,auVar121,auVar16);
  auVar16 = vfmadd231ps_fma(auVar95,auVar121,auVar96);
  auVar17 = vfmadd231ps_fma(auVar12,auVar203,auVar11);
  auVar96 = vfmadd231ps_fma(auVar14,auVar203,auVar15);
  local_430._8_4_ = 0x7fffffff;
  local_430._0_8_ = 0x7fffffff7fffffff;
  local_430._12_4_ = 0x7fffffff;
  auVar134 = vfmadd231ps_fma(auVar16,auVar203,auVar97);
  auVar11 = vandps_avx(auVar146,local_430);
  auVar151._8_4_ = 0x219392ef;
  auVar151._0_8_ = 0x219392ef219392ef;
  auVar151._12_4_ = 0x219392ef;
  auVar11 = vcmpps_avx(auVar11,auVar151,1);
  auVar12 = vblendvps_avx(auVar146,auVar151,auVar11);
  auVar11 = vandps_avx(auVar122,local_430);
  auVar11 = vcmpps_avx(auVar11,auVar151,1);
  auVar14 = vblendvps_avx(auVar122,auVar151,auVar11);
  auVar11 = vandps_avx(local_430,auVar152);
  auVar11 = vcmpps_avx(auVar11,auVar151,1);
  auVar11 = vblendvps_avx(auVar152,auVar151,auVar11);
  auVar15 = vrcpps_avx(auVar12);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar15,auVar176);
  auVar15 = vfmadd132ps_fma(auVar12,auVar15,auVar15);
  auVar12 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar12,auVar176);
  auVar16 = vfmadd132ps_fma(auVar14,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar12,auVar176);
  auVar97 = vfmadd132ps_fma(auVar11,auVar12,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar11 = vpmovsxwd_avx(auVar11);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar14 = vsubps_avx(auVar11,auVar17);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar152._0_4_ = auVar15._0_4_ * auVar14._0_4_;
  auVar152._4_4_ = auVar15._4_4_ * auVar14._4_4_;
  auVar152._8_4_ = auVar15._8_4_ * auVar14._8_4_;
  auVar152._12_4_ = auVar15._12_4_ * auVar14._12_4_;
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar17);
  auVar159._0_4_ = auVar15._0_4_ * auVar11._0_4_;
  auVar159._4_4_ = auVar15._4_4_ * auVar11._4_4_;
  auVar159._8_4_ = auVar15._8_4_ * auVar11._8_4_;
  auVar159._12_4_ = auVar15._12_4_ * auVar11._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar82 * 0xe + 6);
  auVar11 = vpmovsxwd_avx(auVar14);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vsubps_avx(auVar11,auVar96);
  auVar122._1_3_ = 0;
  auVar122[0] = PVar7;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar11 = vpmovsxwd_avx(auVar15);
  auVar170._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar170._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar170._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar170._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar96);
  auVar121._0_4_ = auVar16._0_4_ * auVar11._0_4_;
  auVar121._4_4_ = auVar16._4_4_ * auVar11._4_4_;
  auVar121._8_4_ = auVar16._8_4_ * auVar11._8_4_;
  auVar121._12_4_ = auVar16._12_4_ * auVar11._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar82 * 0x15 + 6);
  auVar11 = vpmovsxwd_avx(auVar16);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar134);
  auVar146._0_4_ = auVar97._0_4_ * auVar11._0_4_;
  auVar146._4_4_ = auVar97._4_4_ * auVar11._4_4_;
  auVar146._8_4_ = auVar97._8_4_ * auVar11._8_4_;
  auVar146._12_4_ = auVar97._12_4_ * auVar11._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar11 = vpmovsxwd_avx(auVar17);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar134);
  auVar96._0_4_ = auVar97._0_4_ * auVar11._0_4_;
  auVar96._4_4_ = auVar97._4_4_ * auVar11._4_4_;
  auVar96._8_4_ = auVar97._8_4_ * auVar11._8_4_;
  auVar96._12_4_ = auVar97._12_4_ * auVar11._12_4_;
  auVar11 = vpminsd_avx(auVar152,auVar159);
  auVar12 = vpminsd_avx(auVar170,auVar121);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  auVar12 = vpminsd_avx(auVar146,auVar96);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar186._4_4_ = uVar91;
  auVar186._0_4_ = uVar91;
  auVar186._8_4_ = uVar91;
  auVar186._12_4_ = uVar91;
  auVar12 = vmaxps_avx(auVar12,auVar186);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  local_440._0_4_ = auVar11._0_4_ * 0.99999964;
  local_440._4_4_ = auVar11._4_4_ * 0.99999964;
  local_440._8_4_ = auVar11._8_4_ * 0.99999964;
  local_440._12_4_ = auVar11._12_4_ * 0.99999964;
  auVar11 = vpmaxsd_avx(auVar152,auVar159);
  auVar12 = vpmaxsd_avx(auVar170,auVar121);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar12 = vpmaxsd_avx(auVar146,auVar96);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar134._4_4_ = uVar91;
  auVar134._0_4_ = uVar91;
  auVar134._8_4_ = uVar91;
  auVar134._12_4_ = uVar91;
  auVar12 = vminps_avx(auVar12,auVar134);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar97._0_4_ = auVar11._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar11._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar11._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar11._12_4_ * 1.0000004;
  auVar122[4] = PVar7;
  auVar122._5_3_ = 0;
  auVar122[8] = PVar7;
  auVar122._9_3_ = 0;
  auVar122[0xc] = PVar7;
  auVar122._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar122,_DAT_01f4ad30);
  auVar11 = vcmpps_avx(local_440,auVar97,2);
  auVar11 = vandps_avx(auVar11,auVar12);
  uVar91 = vmovmskps_avx(auVar11);
  uVar82 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar91);
  local_628 = pre->ray_space + k;
  local_620 = mm_lookupmask_ps._16_8_;
  uStack_618 = mm_lookupmask_ps._24_8_;
  uStack_610 = mm_lookupmask_ps._16_8_;
  uStack_608 = mm_lookupmask_ps._24_8_;
  iVar81 = 1 << ((uint)k & 0x1f);
  auVar100._4_4_ = iVar81;
  auVar100._0_4_ = iVar81;
  auVar100._8_4_ = iVar81;
  auVar100._12_4_ = iVar81;
  auVar100._16_4_ = iVar81;
  auVar100._20_4_ = iVar81;
  auVar100._24_4_ = iVar81;
  auVar100._28_4_ = iVar81;
  auVar20 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar100 = vpand_avx2(auVar100,auVar20);
  local_420 = vpcmpeqd_avx2(auVar100,auVar20);
  for (; auVar100 = local_580, uVar82 != 0;
      uVar82 = (ulong)((uint)uVar82 & (uint)uVar82 + 0xf & uVar86)) {
    lVar92 = 0;
    for (uVar83 = uVar82; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      lVar92 = lVar92 + 1;
    }
    uVar86 = *(uint *)(prim + 2);
    local_6a0._4_4_ = *(undefined4 *)(prim + lVar92 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[uVar86].ptr;
    uVar83 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)(uint)local_6a0._4_4_ *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    lVar88 = (long)pGVar8[1].intersectionFilterN * uVar83;
    p_Var90 = pGVar8[2].intersectionFilterN;
    lVar87 = (long)pGVar8[1].intersectionFilterN * (uVar83 + 1);
    lVar92 = *(long *)&pGVar8[1].time_range.upper;
    local_6b0 = *(undefined1 (*) [16])(lVar92 + lVar88);
    _local_5b0 = *(undefined1 (*) [16])(lVar92 + lVar87);
    auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    uVar91 = *(undefined4 *)(lVar92 + 0xc + lVar88);
    auVar177._4_4_ = uVar91;
    auVar177._0_4_ = uVar91;
    auVar177._8_4_ = uVar91;
    auVar177._12_4_ = uVar91;
    local_3a0._16_4_ = uVar91;
    local_3a0._0_16_ = auVar177;
    local_3a0._20_4_ = uVar91;
    local_3a0._24_4_ = uVar91;
    local_3a0._28_4_ = uVar91;
    iVar81 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar98._8_4_ = 0xbeaaaaab;
    auVar98._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar98._12_4_ = 0xbeaaaaab;
    auVar122 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                 (p_Var90 + uVar83 * (long)pGVar8[2].pointQueryFunc),local_6b0,
                                auVar98);
    auVar17 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (p_Var90 + (long)pGVar8[2].pointQueryFunc * (uVar83 + 1)),_local_5b0,
                              auVar98);
    auVar14 = vsubps_avx(local_6b0,auVar11);
    uVar91 = auVar14._0_4_;
    auVar123._4_4_ = uVar91;
    auVar123._0_4_ = uVar91;
    auVar123._8_4_ = uVar91;
    auVar123._12_4_ = uVar91;
    auVar12 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    aVar4 = (local_628->vx).field_0;
    aVar5 = (local_628->vy).field_0;
    fVar133 = (local_628->vz).field_0.m128[0];
    fVar111 = *(float *)((long)&(local_628->vz).field_0 + 4);
    fVar113 = *(float *)((long)&(local_628->vz).field_0 + 8);
    fVar115 = *(float *)((long)&(local_628->vz).field_0 + 0xc);
    auVar160._0_4_ = fVar133 * auVar14._0_4_;
    auVar160._4_4_ = fVar111 * auVar14._4_4_;
    auVar160._8_4_ = fVar113 * auVar14._8_4_;
    auVar160._12_4_ = fVar115 * auVar14._12_4_;
    auVar12 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar5,auVar12);
    auVar97 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar123);
    auVar15 = vinsertps_avx(auVar97,auVar177,0x30);
    auVar14 = vsubps_avx(auVar122,auVar11);
    uVar91 = auVar14._0_4_;
    auVar161._4_4_ = uVar91;
    auVar161._0_4_ = uVar91;
    auVar161._8_4_ = uVar91;
    auVar161._12_4_ = uVar91;
    auVar12 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar187._0_4_ = fVar133 * auVar14._0_4_;
    auVar187._4_4_ = fVar111 * auVar14._4_4_;
    auVar187._8_4_ = fVar113 * auVar14._8_4_;
    auVar187._12_4_ = fVar115 * auVar14._12_4_;
    auVar12 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar12);
    auVar96 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar161);
    auVar12 = vblendps_avx(auVar96,auVar122,8);
    auVar16 = vsubps_avx(auVar17,auVar11);
    uVar91 = auVar16._0_4_;
    auVar178._4_4_ = uVar91;
    auVar178._0_4_ = uVar91;
    auVar178._8_4_ = uVar91;
    auVar178._12_4_ = uVar91;
    auVar14 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar188._0_4_ = fVar133 * auVar16._0_4_;
    auVar188._4_4_ = fVar111 * auVar16._4_4_;
    auVar188._8_4_ = fVar113 * auVar16._8_4_;
    auVar188._12_4_ = fVar115 * auVar16._12_4_;
    auVar14 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar14);
    auVar134 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar4,auVar178);
    auVar14 = vblendps_avx(auVar134,auVar17,8);
    auVar16 = vsubps_avx(_local_5b0,auVar11);
    auVar11 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar179._0_4_ = fVar133 * auVar11._0_4_;
    auVar179._4_4_ = fVar111 * auVar11._4_4_;
    auVar179._8_4_ = fVar113 * auVar11._8_4_;
    auVar179._12_4_ = fVar115 * auVar11._12_4_;
    uVar91 = auVar16._0_4_;
    auVar171._4_4_ = uVar91;
    auVar171._0_4_ = uVar91;
    auVar171._8_4_ = uVar91;
    auVar171._12_4_ = uVar91;
    auVar11 = vshufps_avx(auVar16,auVar16,0x55);
    auVar11 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar11);
    fVar133 = *(float *)(lVar92 + 0xc + lVar87);
    auVar135._4_4_ = fVar133;
    auVar135._0_4_ = fVar133;
    auVar135._8_4_ = fVar133;
    auVar135._12_4_ = fVar133;
    fStack_3b0 = fVar133;
    _local_3c0 = auVar135;
    fStack_3ac = fVar133;
    fStack_3a8 = fVar133;
    uStack_3a4 = fVar133;
    auVar121 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar171);
    auVar16 = vinsertps_avx(auVar121,auVar135,0x30);
    auVar11 = vandps_avx(auVar15,local_430);
    auVar12 = vandps_avx(auVar12,local_430);
    auVar15 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vandps_avx(auVar14,local_430);
    auVar12 = vandps_avx(auVar16,local_430);
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar15,auVar11);
    auVar12 = vmovshdup_avx(auVar11);
    auVar12 = vmaxss_avx(auVar12,auVar11);
    auVar11 = vshufpd_avx(auVar11,auVar11,1);
    auVar11 = vmaxss_avx(auVar11,auVar12);
    lVar92 = (long)iVar81 * 0x44;
    auVar12 = vmovshdup_avx(auVar97);
    uVar93 = auVar12._0_8_;
    local_600._8_8_ = uVar93;
    local_600._0_8_ = uVar93;
    local_600._16_8_ = uVar93;
    local_600._24_8_ = uVar93;
    auVar12 = vmovshdup_avx(auVar96);
    uVar93 = auVar12._0_8_;
    local_5e0._8_8_ = uVar93;
    local_5e0._0_8_ = uVar93;
    local_5e0._16_8_ = uVar93;
    local_5e0._24_8_ = uVar93;
    auVar20 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 + 0x908);
    auVar12 = vmovshdup_avx(auVar134);
    uVar93 = auVar12._0_8_;
    auVar198._8_8_ = uVar93;
    auVar198._0_8_ = uVar93;
    auVar198._16_8_ = uVar93;
    auVar198._24_8_ = uVar93;
    auVar14 = vmovshdup_avx(auVar121);
    uVar184 = auVar134._0_4_;
    auVar140._4_4_ = uVar184;
    auVar140._0_4_ = uVar184;
    auVar140._8_4_ = uVar184;
    auVar140._12_4_ = uVar184;
    auVar140._16_4_ = uVar184;
    auVar140._20_4_ = uVar184;
    auVar140._24_4_ = uVar184;
    auVar140._28_4_ = uVar184;
    local_4e0 = *(float *)(bezier_basis0 + lVar92 + 0xd8c);
    fStack_4dc = *(float *)(bezier_basis0 + lVar92 + 0xd90);
    fStack_4d8 = *(float *)(bezier_basis0 + lVar92 + 0xd94);
    fStack_4d4 = *(float *)(bezier_basis0 + lVar92 + 0xd98);
    fStack_4d0 = *(float *)(bezier_basis0 + lVar92 + 0xd9c);
    fStack_4cc = *(float *)(bezier_basis0 + lVar92 + 0xda0);
    fStack_4c8 = *(float *)(bezier_basis0 + lVar92 + 0xda4);
    iStack_4c4 = *(int *)(bezier_basis0 + lVar92 + 0xda8);
    fVar174 = auVar121._0_4_;
    auVar108._0_4_ = local_4e0 * fVar174;
    auVar108._4_4_ = fStack_4dc * fVar174;
    auVar108._8_4_ = fStack_4d8 * fVar174;
    auVar108._12_4_ = fStack_4d4 * fVar174;
    auVar108._16_4_ = fStack_4d0 * fVar174;
    auVar108._20_4_ = fStack_4cc * fVar174;
    auVar108._24_4_ = fStack_4c8 * fVar174;
    auVar108._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar108,auVar20,auVar140);
    fVar111 = auVar14._0_4_;
    auVar124._0_4_ = local_4e0 * fVar111;
    fVar115 = auVar14._4_4_;
    auVar124._4_4_ = fStack_4dc * fVar115;
    auVar124._8_4_ = fStack_4d8 * fVar111;
    auVar124._12_4_ = fStack_4d4 * fVar115;
    auVar124._16_4_ = fStack_4d0 * fVar111;
    auVar124._20_4_ = fStack_4cc * fVar115;
    auVar124._24_4_ = fStack_4c8 * fVar111;
    auVar124._28_4_ = 0;
    auVar14 = vfmadd231ps_fma(auVar124,auVar20,auVar198);
    auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 + 0x484);
    auVar164._0_4_ = auVar96._0_4_;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar124,auVar164);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar124,local_5e0);
    auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar92);
    uVar91 = auVar97._0_4_;
    auVar180._4_4_ = uVar91;
    auVar180._0_4_ = uVar91;
    auVar180._8_4_ = uVar91;
    auVar180._12_4_ = uVar91;
    auVar180._16_4_ = uVar91;
    auVar180._20_4_ = uVar91;
    auVar180._24_4_ = uVar91;
    auVar180._28_4_ = uVar91;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar108,auVar180);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar108,local_600);
    auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 + 0x908);
    fVar118 = *(float *)(bezier_basis1 + lVar92 + 0xd8c);
    fVar119 = *(float *)(bezier_basis1 + lVar92 + 0xd90);
    fVar69 = *(float *)(bezier_basis1 + lVar92 + 0xd94);
    fVar70 = *(float *)(bezier_basis1 + lVar92 + 0xd98);
    fVar71 = *(float *)(bezier_basis1 + lVar92 + 0xd9c);
    fVar72 = *(float *)(bezier_basis1 + lVar92 + 0xda0);
    fVar73 = *(float *)(bezier_basis1 + lVar92 + 0xda4);
    auVar6._4_4_ = fVar119 * fVar174;
    auVar6._0_4_ = fVar118 * fVar174;
    auVar6._8_4_ = fVar69 * fVar174;
    auVar6._12_4_ = fVar70 * fVar174;
    auVar6._16_4_ = fVar71 * fVar174;
    auVar6._20_4_ = fVar72 * fVar174;
    auVar6._24_4_ = fVar73 * fVar174;
    auVar6._28_4_ = fVar174;
    auVar16 = vfmadd231ps_fma(auVar6,auVar129,auVar140);
    auVar166._4_4_ = fVar119 * fVar115;
    auVar166._0_4_ = fVar118 * fVar111;
    auVar166._8_4_ = fVar69 * fVar111;
    auVar166._12_4_ = fVar70 * fVar115;
    auVar166._16_4_ = fVar71 * fVar111;
    auVar166._20_4_ = fVar72 * fVar115;
    auVar166._24_4_ = fVar73 * fVar111;
    auVar166._28_4_ = uVar184;
    auVar95 = vfmadd231ps_fma(auVar166,auVar129,auVar198);
    auVar6 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 + 0x484);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar6,auVar164);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar6,local_5e0);
    auVar166 = *(undefined1 (*) [32])(bezier_basis1 + lVar92);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar166,auVar180);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar166,local_600);
    auVar101 = ZEXT1632(auVar16);
    local_480 = ZEXT1632(auVar15);
    auVar110 = vsubps_avx(auVar101,local_480);
    local_460 = ZEXT1632(auVar95);
    local_4a0 = ZEXT1632(auVar14);
    local_4c0 = vsubps_avx(local_460,local_4a0);
    auVar102._0_4_ = auVar110._0_4_ * auVar14._0_4_;
    auVar102._4_4_ = auVar110._4_4_ * auVar14._4_4_;
    auVar102._8_4_ = auVar110._8_4_ * auVar14._8_4_;
    auVar102._12_4_ = auVar110._12_4_ * auVar14._12_4_;
    auVar102._16_4_ = auVar110._16_4_ * 0.0;
    auVar102._20_4_ = auVar110._20_4_ * 0.0;
    auVar102._24_4_ = auVar110._24_4_ * 0.0;
    auVar102._28_4_ = 0;
    fVar113 = local_4c0._0_4_;
    auVar125._0_4_ = auVar15._0_4_ * fVar113;
    fVar183 = local_4c0._4_4_;
    auVar125._4_4_ = auVar15._4_4_ * fVar183;
    fVar132 = local_4c0._8_4_;
    auVar125._8_4_ = auVar15._8_4_ * fVar132;
    fVar112 = local_4c0._12_4_;
    auVar125._12_4_ = auVar15._12_4_ * fVar112;
    fVar114 = local_4c0._16_4_;
    auVar125._16_4_ = fVar114 * 0.0;
    fVar116 = local_4c0._20_4_;
    auVar125._20_4_ = fVar116 * 0.0;
    fVar117 = local_4c0._24_4_;
    auVar125._24_4_ = fVar117 * 0.0;
    auVar125._28_4_ = 0;
    auVar102 = vsubps_avx(auVar102,auVar125);
    auVar14 = vpermilps_avx(auVar122,0xff);
    uVar93 = auVar14._0_8_;
    local_80._8_8_ = uVar93;
    local_80._0_8_ = uVar93;
    local_80._16_8_ = uVar93;
    local_80._24_8_ = uVar93;
    auVar15 = vpermilps_avx(auVar17,0xff);
    local_a0._0_8_ = auVar15._0_8_;
    local_a0._8_8_ = local_a0._0_8_;
    local_a0._16_8_ = local_a0._0_8_;
    local_a0._24_8_ = local_a0._0_8_;
    auVar13._4_4_ = fStack_4dc * fVar133;
    auVar13._0_4_ = local_4e0 * fVar133;
    auVar13._8_4_ = fStack_4d8 * fVar133;
    auVar13._12_4_ = fStack_4d4 * fVar133;
    auVar13._16_4_ = fStack_4d0 * fVar133;
    auVar13._20_4_ = fStack_4cc * fVar133;
    auVar13._24_4_ = fStack_4c8 * fVar133;
    auVar13._28_4_ = iStack_4c4;
    auVar15 = vfmadd231ps_fma(auVar13,auVar20,local_a0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar124,local_80);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar108,local_3a0);
    auVar201._4_4_ = fVar119 * fVar133;
    auVar201._0_4_ = fVar118 * fVar133;
    auVar201._8_4_ = fVar69 * fVar133;
    auVar201._12_4_ = fVar70 * fVar133;
    auVar201._16_4_ = fVar71 * fVar133;
    auVar201._20_4_ = fVar72 * fVar133;
    auVar201._24_4_ = fVar73 * fVar133;
    auVar201._28_4_ = auVar108._28_4_;
    auVar16 = vfmadd231ps_fma(auVar201,auVar129,local_a0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar6,local_80);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar166,local_3a0);
    auVar10._4_4_ = fVar183 * fVar183;
    auVar10._0_4_ = fVar113 * fVar113;
    auVar10._8_4_ = fVar132 * fVar132;
    auVar10._12_4_ = fVar112 * fVar112;
    auVar10._16_4_ = fVar114 * fVar114;
    auVar10._20_4_ = fVar116 * fVar116;
    auVar10._24_4_ = fVar117 * fVar117;
    auVar10._28_4_ = auVar14._4_4_;
    auVar14 = vfmadd231ps_fma(auVar10,auVar110,auVar110);
    auVar13 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar18._4_4_ = auVar13._4_4_ * auVar13._4_4_ * auVar14._4_4_;
    auVar18._0_4_ = auVar13._0_4_ * auVar13._0_4_ * auVar14._0_4_;
    auVar18._8_4_ = auVar13._8_4_ * auVar13._8_4_ * auVar14._8_4_;
    auVar18._12_4_ = auVar13._12_4_ * auVar13._12_4_ * auVar14._12_4_;
    auVar18._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
    auVar18._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
    auVar18._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
    auVar18._28_4_ = auVar13._28_4_;
    auVar19._4_4_ = auVar102._4_4_ * auVar102._4_4_;
    auVar19._0_4_ = auVar102._0_4_ * auVar102._0_4_;
    auVar19._8_4_ = auVar102._8_4_ * auVar102._8_4_;
    auVar19._12_4_ = auVar102._12_4_ * auVar102._12_4_;
    auVar19._16_4_ = auVar102._16_4_ * auVar102._16_4_;
    auVar19._20_4_ = auVar102._20_4_ * auVar102._20_4_;
    auVar19._24_4_ = auVar102._24_4_ * auVar102._24_4_;
    auVar19._28_4_ = auVar102._28_4_;
    auVar13 = vcmpps_avx(auVar19,auVar18,2);
    fVar133 = auVar11._0_4_ * 4.7683716e-07;
    auVar103._0_4_ = (float)iVar81;
    local_580._4_12_ = auVar134._4_12_;
    local_580._0_4_ = auVar103._0_4_;
    local_580._16_16_ = auVar100._16_16_;
    auVar103._4_4_ = auVar103._0_4_;
    auVar103._8_4_ = auVar103._0_4_;
    auVar103._12_4_ = auVar103._0_4_;
    auVar103._16_4_ = auVar103._0_4_;
    auVar103._20_4_ = auVar103._0_4_;
    auVar103._24_4_ = auVar103._0_4_;
    auVar103._28_4_ = auVar103._0_4_;
    auVar100 = vcmpps_avx(_DAT_01f7b060,auVar103,1);
    auVar14 = vpermilps_avx(auVar97,0xaa);
    uVar93 = auVar14._0_8_;
    auVar204._8_8_ = uVar93;
    auVar204._0_8_ = uVar93;
    auVar204._16_8_ = uVar93;
    auVar204._24_8_ = uVar93;
    auVar11 = vpermilps_avx(auVar96,0xaa);
    uVar93 = auVar11._0_8_;
    local_c0._8_8_ = uVar93;
    local_c0._0_8_ = uVar93;
    local_c0._16_8_ = uVar93;
    local_c0._24_8_ = uVar93;
    auVar11 = vshufps_avx(auVar134,auVar134,0xaa);
    uVar93 = auVar11._0_8_;
    local_560._8_8_ = uVar93;
    local_560._0_8_ = uVar93;
    local_560._16_8_ = uVar93;
    local_560._24_8_ = uVar93;
    auVar11 = vpermilps_avx(auVar121,0xaa);
    auVar102 = auVar100 & auVar13;
    local_5a0 = ZEXT416((uint)local_6a0._4_4_);
    uVar91 = *(undefined4 *)(ray + k * 4 + 0x60);
    fVar113 = auVar11._0_4_;
    fVar183 = auVar11._4_4_;
    local_730 = auVar122._0_8_;
    uStack_728 = auVar122._8_8_;
    local_740 = auVar17._0_8_;
    uStack_738 = auVar17._8_8_;
    local_5a0._0_4_ = local_6a0._4_4_;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar102 >> 0x7f,0) == '\0') &&
          (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0xbf,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f])
    {
      p_Var90 = (RTCFilterFunctionN)0x0;
    }
    else {
      _local_500 = vandps_avx(auVar13,auVar100);
      auVar200._4_4_ = fVar183 * fVar119;
      auVar200._0_4_ = fVar113 * fVar118;
      auVar200._8_4_ = fVar113 * fVar69;
      auVar200._12_4_ = fVar183 * fVar70;
      auVar200._16_4_ = fVar113 * fVar71;
      auVar200._20_4_ = fVar183 * fVar72;
      auVar200._24_4_ = fVar113 * fVar73;
      auVar200._28_4_ = local_500._28_4_;
      auVar11 = vfmadd213ps_fma(auVar129,local_560,auVar200);
      auVar11 = vfmadd213ps_fma(auVar6,local_c0,ZEXT1632(auVar11));
      auVar11 = vfmadd213ps_fma(auVar166,auVar204,ZEXT1632(auVar11));
      auVar104._0_4_ = fVar113 * local_4e0;
      auVar104._4_4_ = fVar183 * fStack_4dc;
      auVar104._8_4_ = fVar113 * fStack_4d8;
      auVar104._12_4_ = fVar183 * fStack_4d4;
      auVar104._16_4_ = fVar113 * fStack_4d0;
      auVar104._20_4_ = fVar183 * fStack_4cc;
      auVar104._24_4_ = fVar113 * fStack_4c8;
      auVar104._28_4_ = 0;
      auVar97 = vfmadd213ps_fma(auVar20,local_560,auVar104);
      auVar97 = vfmadd213ps_fma(auVar124,local_c0,ZEXT1632(auVar97));
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 + 0x1210);
      auVar20 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 + 0x1694);
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 + 0x1b18);
      fVar132 = *(float *)(bezier_basis0 + lVar92 + 0x1f9c);
      fVar112 = *(float *)(bezier_basis0 + lVar92 + 0x1fa0);
      fVar114 = *(float *)(bezier_basis0 + lVar92 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis0 + lVar92 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis0 + lVar92 + 0x1fac);
      fVar118 = *(float *)(bezier_basis0 + lVar92 + 0x1fb0);
      fVar119 = *(float *)(bezier_basis0 + lVar92 + 0x1fb4);
      auVar165._0_4_ = fVar132 * fVar174;
      auVar165._4_4_ = fVar112 * fVar174;
      auVar165._8_4_ = fVar114 * fVar174;
      auVar165._12_4_ = fVar116 * fVar174;
      auVar165._16_4_ = fVar117 * fVar174;
      auVar165._20_4_ = fVar118 * fVar174;
      auVar165._24_4_ = fVar119 * fVar174;
      auVar165._28_4_ = 0;
      auVar129._4_4_ = fVar115 * fVar112;
      auVar129._0_4_ = fVar111 * fVar132;
      auVar129._8_4_ = fVar111 * fVar114;
      auVar129._12_4_ = fVar115 * fVar116;
      auVar129._16_4_ = fVar111 * fVar117;
      auVar129._20_4_ = fVar115 * fVar118;
      auVar129._24_4_ = fVar111 * fVar119;
      auVar129._28_4_ = fVar183;
      auVar22._4_4_ = fVar183 * fVar112;
      auVar22._0_4_ = fVar113 * fVar132;
      auVar22._8_4_ = fVar113 * fVar114;
      auVar22._12_4_ = fVar183 * fVar116;
      auVar22._16_4_ = fVar113 * fVar117;
      auVar22._20_4_ = fVar183 * fVar118;
      auVar22._24_4_ = fVar113 * fVar119;
      auVar22._28_4_ = fVar183;
      auVar96 = vfmadd231ps_fma(auVar165,auVar124,auVar140);
      auVar134 = vfmadd231ps_fma(auVar129,auVar124,auVar198);
      auVar121 = vfmadd231ps_fma(auVar22,local_560,auVar124);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar20,auVar164);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar20,local_5e0);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_c0,auVar20);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar100,auVar180);
      auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar100,local_600);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar204,auVar100);
      fVar132 = *(float *)(bezier_basis1 + lVar92 + 0x1f9c);
      fVar112 = *(float *)(bezier_basis1 + lVar92 + 0x1fa0);
      fVar114 = *(float *)(bezier_basis1 + lVar92 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis1 + lVar92 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis1 + lVar92 + 0x1fac);
      fVar118 = *(float *)(bezier_basis1 + lVar92 + 0x1fb0);
      fVar119 = *(float *)(bezier_basis1 + lVar92 + 0x1fb4);
      auVar196._0_4_ = fVar174 * fVar132;
      auVar196._4_4_ = fVar174 * fVar112;
      auVar196._8_4_ = fVar174 * fVar114;
      auVar196._12_4_ = fVar174 * fVar116;
      auVar196._16_4_ = fVar174 * fVar117;
      auVar196._20_4_ = fVar174 * fVar118;
      auVar196._24_4_ = fVar174 * fVar119;
      auVar196._28_4_ = 0;
      auVar20._4_4_ = fVar115 * fVar112;
      auVar20._0_4_ = fVar111 * fVar132;
      auVar20._8_4_ = fVar111 * fVar114;
      auVar20._12_4_ = fVar115 * fVar116;
      auVar20._16_4_ = fVar111 * fVar117;
      auVar20._20_4_ = fVar115 * fVar118;
      auVar20._24_4_ = fVar111 * fVar119;
      auVar20._28_4_ = fVar115;
      auVar23._4_4_ = fVar112 * fVar183;
      auVar23._0_4_ = fVar132 * fVar113;
      auVar23._8_4_ = fVar114 * fVar113;
      auVar23._12_4_ = fVar116 * fVar183;
      auVar23._16_4_ = fVar117 * fVar113;
      auVar23._20_4_ = fVar118 * fVar183;
      auVar23._24_4_ = fVar119 * fVar113;
      auVar23._28_4_ = auVar14._4_4_;
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar196,auVar100,auVar140);
      auVar95 = vfmadd231ps_fma(auVar20,auVar100,auVar198);
      auVar146 = vfmadd231ps_fma(auVar23,auVar100,local_560);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar100,auVar164);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar100,local_5e0);
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),local_c0,auVar100);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar100,auVar180);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar100,local_600);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar126._16_4_ = 0x7fffffff;
      auVar126._20_4_ = 0x7fffffff;
      auVar126._24_4_ = 0x7fffffff;
      auVar126._28_4_ = 0x7fffffff;
      auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar204,auVar100);
      auVar100 = vandps_avx(ZEXT1632(auVar96),auVar126);
      auVar20 = vandps_avx(ZEXT1632(auVar134),auVar126);
      auVar20 = vmaxps_avx(auVar100,auVar20);
      auVar100 = vandps_avx(ZEXT1632(auVar121),auVar126);
      auVar100 = vmaxps_avx(auVar20,auVar100);
      auVar141._4_4_ = fVar133;
      auVar141._0_4_ = fVar133;
      auVar141._8_4_ = fVar133;
      auVar141._12_4_ = fVar133;
      auVar141._16_4_ = fVar133;
      auVar141._20_4_ = fVar133;
      auVar141._24_4_ = fVar133;
      auVar141._28_4_ = fVar133;
      auVar100 = vcmpps_avx(auVar100,auVar141,1);
      auVar124 = vblendvps_avx(ZEXT1632(auVar96),auVar110,auVar100);
      auVar129 = vblendvps_avx(ZEXT1632(auVar134),local_4c0,auVar100);
      auVar100 = vandps_avx(ZEXT1632(auVar14),auVar126);
      auVar20 = vandps_avx(ZEXT1632(auVar95),auVar126);
      auVar6 = vmaxps_avx(auVar100,auVar20);
      auVar100 = vandps_avx(ZEXT1632(auVar146),auVar126);
      auVar100 = vmaxps_avx(auVar6,auVar100);
      auVar166 = vcmpps_avx(auVar100,auVar141,1);
      auVar100 = vblendvps_avx(ZEXT1632(auVar14),auVar110,auVar166);
      auVar6 = vblendvps_avx(ZEXT1632(auVar95),local_4c0,auVar166);
      auVar14 = vfmadd213ps_fma(auVar108,auVar204,ZEXT1632(auVar97));
      auVar97 = vfmadd213ps_fma(auVar124,auVar124,ZEXT832(0) << 0x20);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar129,auVar129);
      auVar108 = vrsqrtps_avx(ZEXT1632(auVar97));
      fVar132 = auVar108._0_4_;
      fVar112 = auVar108._4_4_;
      fVar114 = auVar108._8_4_;
      fVar116 = auVar108._12_4_;
      fVar117 = auVar108._16_4_;
      fVar118 = auVar108._20_4_;
      fVar119 = auVar108._24_4_;
      auVar110._4_4_ = fVar112 * fVar112 * fVar112 * auVar97._4_4_ * -0.5;
      auVar110._0_4_ = fVar132 * fVar132 * fVar132 * auVar97._0_4_ * -0.5;
      auVar110._8_4_ = fVar114 * fVar114 * fVar114 * auVar97._8_4_ * -0.5;
      auVar110._12_4_ = fVar116 * fVar116 * fVar116 * auVar97._12_4_ * -0.5;
      auVar110._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar110._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar110._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
      auVar110._28_4_ = auVar20._28_4_;
      auVar147._8_4_ = 0x3fc00000;
      auVar147._0_8_ = 0x3fc000003fc00000;
      auVar147._12_4_ = 0x3fc00000;
      auVar147._16_4_ = 0x3fc00000;
      auVar147._20_4_ = 0x3fc00000;
      auVar147._24_4_ = 0x3fc00000;
      auVar147._28_4_ = 0x3fc00000;
      auVar97 = vfmadd231ps_fma(auVar110,auVar147,auVar108);
      fVar132 = auVar97._0_4_;
      fVar112 = auVar97._4_4_;
      auVar24._4_4_ = fVar112 * auVar129._4_4_;
      auVar24._0_4_ = fVar132 * auVar129._0_4_;
      fVar114 = auVar97._8_4_;
      auVar24._8_4_ = fVar114 * auVar129._8_4_;
      fVar116 = auVar97._12_4_;
      auVar24._12_4_ = fVar116 * auVar129._12_4_;
      auVar24._16_4_ = auVar129._16_4_ * 0.0;
      auVar24._20_4_ = auVar129._20_4_ * 0.0;
      auVar24._24_4_ = auVar129._24_4_ * 0.0;
      auVar24._28_4_ = 0;
      auVar25._4_4_ = fVar112 * -auVar124._4_4_;
      auVar25._0_4_ = fVar132 * -auVar124._0_4_;
      auVar25._8_4_ = fVar114 * -auVar124._8_4_;
      auVar25._12_4_ = fVar116 * -auVar124._12_4_;
      auVar25._16_4_ = -auVar124._16_4_ * 0.0;
      auVar25._20_4_ = -auVar124._20_4_ * 0.0;
      auVar25._24_4_ = -auVar124._24_4_ * 0.0;
      auVar25._28_4_ = auVar108._28_4_;
      auVar97 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar6,auVar6);
      auVar20 = vrsqrtps_avx(ZEXT1632(auVar97));
      auVar124 = ZEXT832(0) << 0x20;
      auVar26._28_4_ = auVar166._28_4_;
      auVar26._0_28_ =
           ZEXT1628(CONCAT412(fVar116 * 0.0,
                              CONCAT48(fVar114 * 0.0,CONCAT44(fVar112 * 0.0,fVar132 * 0.0))));
      fVar132 = auVar20._0_4_;
      fVar112 = auVar20._4_4_;
      fVar114 = auVar20._8_4_;
      fVar116 = auVar20._12_4_;
      fVar117 = auVar20._16_4_;
      fVar118 = auVar20._20_4_;
      fVar119 = auVar20._24_4_;
      auVar27._4_4_ = fVar112 * fVar112 * fVar112 * auVar97._4_4_ * -0.5;
      auVar27._0_4_ = fVar132 * fVar132 * fVar132 * auVar97._0_4_ * -0.5;
      auVar27._8_4_ = fVar114 * fVar114 * fVar114 * auVar97._8_4_ * -0.5;
      auVar27._12_4_ = fVar116 * fVar116 * fVar116 * auVar97._12_4_ * -0.5;
      auVar27._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar27._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar27._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
      auVar27._28_4_ = 0;
      auVar97 = vfmadd231ps_fma(auVar27,auVar147,auVar20);
      fVar132 = auVar97._0_4_;
      fVar112 = auVar97._4_4_;
      auVar28._4_4_ = auVar6._4_4_ * fVar112;
      auVar28._0_4_ = auVar6._0_4_ * fVar132;
      fVar114 = auVar97._8_4_;
      auVar28._8_4_ = auVar6._8_4_ * fVar114;
      fVar116 = auVar97._12_4_;
      auVar28._12_4_ = auVar6._12_4_ * fVar116;
      auVar28._16_4_ = auVar6._16_4_ * 0.0;
      auVar28._20_4_ = auVar6._20_4_ * 0.0;
      auVar28._24_4_ = auVar6._24_4_ * 0.0;
      auVar28._28_4_ = 0xbf000000;
      auVar29._4_4_ = -auVar100._4_4_ * fVar112;
      auVar29._0_4_ = -auVar100._0_4_ * fVar132;
      auVar29._8_4_ = -auVar100._8_4_ * fVar114;
      auVar29._12_4_ = -auVar100._12_4_ * fVar116;
      auVar29._16_4_ = -auVar100._16_4_ * 0.0;
      auVar29._20_4_ = -auVar100._20_4_ * 0.0;
      auVar29._24_4_ = -auVar100._24_4_ * 0.0;
      auVar29._28_4_ = auVar6._28_4_;
      auVar30._28_4_ = auVar20._28_4_;
      auVar30._0_28_ =
           ZEXT1628(CONCAT412(fVar116 * 0.0,
                              CONCAT48(fVar114 * 0.0,CONCAT44(fVar112 * 0.0,fVar132 * 0.0))));
      auVar97 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar15),local_480);
      auVar100 = ZEXT1632(auVar15);
      auVar96 = vfmadd213ps_fma(auVar25,auVar100,local_4a0);
      auVar134 = vfmadd213ps_fma(auVar26,auVar100,ZEXT1632(auVar14));
      auVar146 = vfnmadd213ps_fma(auVar24,auVar100,local_480);
      auVar121 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar16),auVar101);
      auVar152 = vfnmadd213ps_fma(auVar25,auVar100,local_4a0);
      auVar100 = ZEXT1632(auVar16);
      auVar95 = vfmadd213ps_fma(auVar29,auVar100,local_460);
      auVar200 = ZEXT1632(auVar15);
      auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar200,auVar26);
      auVar14 = vfmadd213ps_fma(auVar30,auVar100,ZEXT1632(auVar11));
      auVar94 = vfnmadd213ps_fma(auVar28,auVar100,auVar101);
      auVar120 = vfnmadd213ps_fma(auVar29,auVar100,local_460);
      auVar157 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar16),auVar30);
      auVar100 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar152));
      auVar20 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar151));
      auVar101._4_4_ = auVar151._4_4_ * auVar100._4_4_;
      auVar101._0_4_ = auVar151._0_4_ * auVar100._0_4_;
      auVar101._8_4_ = auVar151._8_4_ * auVar100._8_4_;
      auVar101._12_4_ = auVar151._12_4_ * auVar100._12_4_;
      auVar101._16_4_ = auVar100._16_4_ * 0.0;
      auVar101._20_4_ = auVar100._20_4_ * 0.0;
      auVar101._24_4_ = auVar100._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar152),auVar20);
      auVar31._4_4_ = auVar20._4_4_ * auVar146._4_4_;
      auVar31._0_4_ = auVar20._0_4_ * auVar146._0_4_;
      auVar31._8_4_ = auVar20._8_4_ * auVar146._8_4_;
      auVar31._12_4_ = auVar20._12_4_ * auVar146._12_4_;
      auVar31._16_4_ = auVar20._16_4_ * 0.0;
      auVar31._20_4_ = auVar20._20_4_ * 0.0;
      auVar31._24_4_ = auVar20._24_4_ * 0.0;
      auVar31._28_4_ = auVar20._28_4_;
      auVar20 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar146));
      auVar11 = vfmsub231ps_fma(auVar31,ZEXT1632(auVar151),auVar20);
      auVar32._4_4_ = auVar152._4_4_ * auVar20._4_4_;
      auVar32._0_4_ = auVar152._0_4_ * auVar20._0_4_;
      auVar32._8_4_ = auVar152._8_4_ * auVar20._8_4_;
      auVar32._12_4_ = auVar152._12_4_ * auVar20._12_4_;
      auVar32._16_4_ = auVar20._16_4_ * 0.0;
      auVar32._20_4_ = auVar20._20_4_ * 0.0;
      auVar32._24_4_ = auVar20._24_4_ * 0.0;
      auVar32._28_4_ = auVar20._28_4_;
      auVar166 = ZEXT1632(auVar146);
      auVar146 = vfmsub231ps_fma(auVar32,auVar166,auVar100);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar124,ZEXT1632(auVar11));
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar124,ZEXT1632(auVar15));
      auVar102 = vcmpps_avx(ZEXT1632(auVar11),auVar124,2);
      auVar100 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar97),auVar102);
      auVar20 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar96),auVar102);
      auVar124 = vblendvps_avx(ZEXT1632(auVar157),ZEXT1632(auVar134),auVar102);
      auVar108 = vblendvps_avx(auVar166,ZEXT1632(auVar121),auVar102);
      auVar129 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar95),auVar102);
      auVar6 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar14),auVar102);
      auVar166 = vblendvps_avx(ZEXT1632(auVar121),auVar166,auVar102);
      auVar13 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar152),auVar102);
      auVar11 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
      auVar110 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar151),auVar102);
      auVar201 = vsubps_avx(auVar166,auVar100);
      auVar10 = vsubps_avx(auVar13,auVar20);
      auVar18 = vsubps_avx(auVar110,auVar124);
      auVar19 = vsubps_avx(auVar100,auVar108);
      auVar101 = vsubps_avx(auVar20,auVar129);
      auVar125 = vsubps_avx(auVar124,auVar6);
      auVar33._4_4_ = auVar18._4_4_ * auVar100._4_4_;
      auVar33._0_4_ = auVar18._0_4_ * auVar100._0_4_;
      auVar33._8_4_ = auVar18._8_4_ * auVar100._8_4_;
      auVar33._12_4_ = auVar18._12_4_ * auVar100._12_4_;
      auVar33._16_4_ = auVar18._16_4_ * auVar100._16_4_;
      auVar33._20_4_ = auVar18._20_4_ * auVar100._20_4_;
      auVar33._24_4_ = auVar18._24_4_ * auVar100._24_4_;
      auVar33._28_4_ = auVar110._28_4_;
      auVar14 = vfmsub231ps_fma(auVar33,auVar124,auVar201);
      auVar34._4_4_ = auVar201._4_4_ * auVar20._4_4_;
      auVar34._0_4_ = auVar201._0_4_ * auVar20._0_4_;
      auVar34._8_4_ = auVar201._8_4_ * auVar20._8_4_;
      auVar34._12_4_ = auVar201._12_4_ * auVar20._12_4_;
      auVar34._16_4_ = auVar201._16_4_ * auVar20._16_4_;
      auVar34._20_4_ = auVar201._20_4_ * auVar20._20_4_;
      auVar34._24_4_ = auVar201._24_4_ * auVar20._24_4_;
      auVar34._28_4_ = auVar166._28_4_;
      auVar15 = vfmsub231ps_fma(auVar34,auVar100,auVar10);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar105._0_4_ = auVar10._0_4_ * auVar124._0_4_;
      auVar105._4_4_ = auVar10._4_4_ * auVar124._4_4_;
      auVar105._8_4_ = auVar10._8_4_ * auVar124._8_4_;
      auVar105._12_4_ = auVar10._12_4_ * auVar124._12_4_;
      auVar105._16_4_ = auVar10._16_4_ * auVar124._16_4_;
      auVar105._20_4_ = auVar10._20_4_ * auVar124._20_4_;
      auVar105._24_4_ = auVar10._24_4_ * auVar124._24_4_;
      auVar105._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar105,auVar20,auVar18);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar106._0_4_ = auVar125._0_4_ * auVar108._0_4_;
      auVar106._4_4_ = auVar125._4_4_ * auVar108._4_4_;
      auVar106._8_4_ = auVar125._8_4_ * auVar108._8_4_;
      auVar106._12_4_ = auVar125._12_4_ * auVar108._12_4_;
      auVar106._16_4_ = auVar125._16_4_ * auVar108._16_4_;
      auVar106._20_4_ = auVar125._20_4_ * auVar108._20_4_;
      auVar106._24_4_ = auVar125._24_4_ * auVar108._24_4_;
      auVar106._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar106,auVar19,auVar6);
      auVar35._4_4_ = auVar101._4_4_ * auVar6._4_4_;
      auVar35._0_4_ = auVar101._0_4_ * auVar6._0_4_;
      auVar35._8_4_ = auVar101._8_4_ * auVar6._8_4_;
      auVar35._12_4_ = auVar101._12_4_ * auVar6._12_4_;
      auVar35._16_4_ = auVar101._16_4_ * auVar6._16_4_;
      auVar35._20_4_ = auVar101._20_4_ * auVar6._20_4_;
      auVar35._24_4_ = auVar101._24_4_ * auVar6._24_4_;
      auVar35._28_4_ = auVar6._28_4_;
      auVar97 = vfmsub231ps_fma(auVar35,auVar129,auVar125);
      auVar36._4_4_ = auVar19._4_4_ * auVar129._4_4_;
      auVar36._0_4_ = auVar19._0_4_ * auVar129._0_4_;
      auVar36._8_4_ = auVar19._8_4_ * auVar129._8_4_;
      auVar36._12_4_ = auVar19._12_4_ * auVar129._12_4_;
      auVar36._16_4_ = auVar19._16_4_ * auVar129._16_4_;
      auVar36._20_4_ = auVar19._20_4_ * auVar129._20_4_;
      auVar36._24_4_ = auVar19._24_4_ * auVar129._24_4_;
      auVar36._28_4_ = auVar13._28_4_;
      auVar96 = vfmsub231ps_fma(auVar36,auVar101,auVar108);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
      auVar108 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar97));
      auVar108 = vcmpps_avx(auVar108,ZEXT832(0) << 0x20,2);
      auVar14 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
      auVar11 = vpand_avx(auVar14,auVar11);
      auVar108 = vpmovsxwd_avx2(auVar11);
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) {
        auVar192 = ZEXT864(0) << 0x20;
LAB_01156924:
        auVar156 = ZEXT3264(CONCAT824(uStack_608,
                                      CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
      }
      else {
        auVar37._4_4_ = auVar10._4_4_ * auVar125._4_4_;
        auVar37._0_4_ = auVar10._0_4_ * auVar125._0_4_;
        auVar37._8_4_ = auVar10._8_4_ * auVar125._8_4_;
        auVar37._12_4_ = auVar10._12_4_ * auVar125._12_4_;
        auVar37._16_4_ = auVar10._16_4_ * auVar125._16_4_;
        auVar37._20_4_ = auVar10._20_4_ * auVar125._20_4_;
        auVar37._24_4_ = auVar10._24_4_ * auVar125._24_4_;
        auVar37._28_4_ = auVar108._28_4_;
        auVar121 = vfmsub231ps_fma(auVar37,auVar101,auVar18);
        auVar127._0_4_ = auVar19._0_4_ * auVar18._0_4_;
        auVar127._4_4_ = auVar19._4_4_ * auVar18._4_4_;
        auVar127._8_4_ = auVar19._8_4_ * auVar18._8_4_;
        auVar127._12_4_ = auVar19._12_4_ * auVar18._12_4_;
        auVar127._16_4_ = auVar19._16_4_ * auVar18._16_4_;
        auVar127._20_4_ = auVar19._20_4_ * auVar18._20_4_;
        auVar127._24_4_ = auVar19._24_4_ * auVar18._24_4_;
        auVar127._28_4_ = 0;
        auVar134 = vfmsub231ps_fma(auVar127,auVar201,auVar125);
        auVar38._4_4_ = auVar201._4_4_ * auVar101._4_4_;
        auVar38._0_4_ = auVar201._0_4_ * auVar101._0_4_;
        auVar38._8_4_ = auVar201._8_4_ * auVar101._8_4_;
        auVar38._12_4_ = auVar201._12_4_ * auVar101._12_4_;
        auVar38._16_4_ = auVar201._16_4_ * auVar101._16_4_;
        auVar38._20_4_ = auVar201._20_4_ * auVar101._20_4_;
        auVar38._24_4_ = auVar201._24_4_ * auVar101._24_4_;
        auVar38._28_4_ = auVar129._28_4_;
        auVar95 = vfmsub231ps_fma(auVar38,auVar19,auVar10);
        auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar134),ZEXT1632(auVar95));
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar121),_DAT_01f7b000);
        auVar108 = vrcpps_avx(ZEXT1632(auVar96));
        auVar194._8_4_ = 0x3f800000;
        auVar194._0_8_ = 0x3f8000003f800000;
        auVar194._12_4_ = 0x3f800000;
        auVar194._16_4_ = 0x3f800000;
        auVar194._20_4_ = 0x3f800000;
        auVar194._24_4_ = 0x3f800000;
        auVar194._28_4_ = 0x3f800000;
        auVar14 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar96),auVar194);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar108,auVar108);
        auVar172._0_4_ = auVar124._0_4_ * auVar95._0_4_;
        auVar172._4_4_ = auVar124._4_4_ * auVar95._4_4_;
        auVar172._8_4_ = auVar124._8_4_ * auVar95._8_4_;
        auVar172._12_4_ = auVar124._12_4_ * auVar95._12_4_;
        auVar172._16_4_ = auVar124._16_4_ * 0.0;
        auVar172._20_4_ = auVar124._20_4_ * 0.0;
        auVar172._24_4_ = auVar124._24_4_ * 0.0;
        auVar172._28_4_ = 0;
        auVar134 = vfmadd231ps_fma(auVar172,auVar20,ZEXT1632(auVar134));
        auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),ZEXT1632(auVar121),auVar100);
        fVar132 = auVar14._0_4_;
        fVar112 = auVar14._4_4_;
        fVar114 = auVar14._8_4_;
        fVar116 = auVar14._12_4_;
        auVar124 = ZEXT1632(CONCAT412(fVar116 * auVar134._12_4_,
                                      CONCAT48(fVar114 * auVar134._8_4_,
                                               CONCAT44(fVar112 * auVar134._4_4_,
                                                        fVar132 * auVar134._0_4_))));
        auVar107._4_4_ = uVar91;
        auVar107._0_4_ = uVar91;
        auVar107._8_4_ = uVar91;
        auVar107._12_4_ = uVar91;
        auVar107._16_4_ = uVar91;
        auVar107._20_4_ = uVar91;
        auVar107._24_4_ = uVar91;
        auVar107._28_4_ = uVar91;
        uVar89 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar128._4_4_ = uVar89;
        auVar128._0_4_ = uVar89;
        auVar128._8_4_ = uVar89;
        auVar128._12_4_ = uVar89;
        auVar128._16_4_ = uVar89;
        auVar128._20_4_ = uVar89;
        auVar128._24_4_ = uVar89;
        auVar128._28_4_ = uVar89;
        auVar100 = vcmpps_avx(auVar107,auVar124,2);
        auVar20 = vcmpps_avx(auVar124,auVar128,2);
        auVar100 = vandps_avx(auVar20,auVar100);
        auVar14 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
        auVar11 = vpand_avx(auVar11,auVar14);
        auVar100 = vpmovsxwd_avx2(auVar11);
        auVar192 = ZEXT864(0) << 0x20;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) goto LAB_01156924;
        auVar100 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar96),4);
        auVar14 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
        auVar11 = vpand_avx(auVar11,auVar14);
        auVar100 = vpmovsxwd_avx2(auVar11);
        auVar156 = ZEXT3264(CONCAT824(uStack_608,
                                      CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          auVar108 = ZEXT1632(CONCAT412(fVar116 * auVar15._12_4_,
                                        CONCAT48(fVar114 * auVar15._8_4_,
                                                 CONCAT44(fVar112 * auVar15._4_4_,
                                                          fVar132 * auVar15._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar116 * auVar97._12_4_,
                                        CONCAT48(fVar114 * auVar97._8_4_,
                                                 CONCAT44(fVar112 * auVar97._4_4_,
                                                          fVar132 * auVar97._0_4_))));
          auVar155._8_4_ = 0x3f800000;
          auVar155._0_8_ = 0x3f8000003f800000;
          auVar155._12_4_ = 0x3f800000;
          auVar155._16_4_ = 0x3f800000;
          auVar155._20_4_ = 0x3f800000;
          auVar155._24_4_ = 0x3f800000;
          auVar155._28_4_ = 0x3f800000;
          auVar20 = vsubps_avx(auVar155,auVar108);
          _local_3e0 = vblendvps_avx(auVar20,auVar108,auVar102);
          auVar20 = vsubps_avx(auVar155,auVar129);
          local_520 = vblendvps_avx(auVar20,auVar129,auVar102);
          auVar156 = ZEXT3264(auVar100);
          local_400 = auVar124;
        }
      }
      auVar207 = ZEXT3264(auVar204);
      auVar100 = auVar156._0_32_;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar156 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar156 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar156[0x1f]) {
        p_Var90 = (RTCFilterFunctionN)0x0;
      }
      else {
        auVar20 = vsubps_avx(ZEXT1632(auVar16),auVar200);
        auVar11 = vfmadd213ps_fma(auVar20,_local_3e0,auVar200);
        fVar132 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar39._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar132;
        auVar39._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar132;
        auVar39._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar132;
        auVar39._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar132;
        auVar39._16_4_ = fVar132 * 0.0;
        auVar39._20_4_ = fVar132 * 0.0;
        auVar39._24_4_ = fVar132 * 0.0;
        auVar39._28_4_ = 0;
        auVar20 = vcmpps_avx(local_400,auVar39,6);
        auVar124 = auVar100 & auVar20;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          p_Var90 = (RTCFilterFunctionN)0x0;
        }
        else {
          auVar130._8_4_ = 0xbf800000;
          auVar130._0_8_ = 0xbf800000bf800000;
          auVar130._12_4_ = 0xbf800000;
          auVar130._16_4_ = 0xbf800000;
          auVar130._20_4_ = 0xbf800000;
          auVar130._24_4_ = 0xbf800000;
          auVar130._28_4_ = 0xbf800000;
          auVar142._8_4_ = 0x40000000;
          auVar142._0_8_ = 0x4000000040000000;
          auVar142._12_4_ = 0x40000000;
          auVar142._16_4_ = 0x40000000;
          auVar142._20_4_ = 0x40000000;
          auVar142._24_4_ = 0x40000000;
          auVar142._28_4_ = 0x40000000;
          auVar11 = vfmadd213ps_fma(local_520,auVar142,auVar130);
          local_380 = _local_3e0;
          local_360 = ZEXT1632(auVar11);
          local_340 = local_400;
          local_320 = 0;
          local_310 = local_6b0._0_8_;
          uStack_308 = local_6b0._8_8_;
          local_300 = local_730;
          uStack_2f8 = uStack_728;
          local_2f0 = local_740;
          uStack_2e8 = uStack_738;
          local_520 = local_360;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            p_Var90 = (RTCFilterFunctionN)0x0;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (p_Var90 = (RTCFilterFunctionN)CONCAT71((int7)((ulong)p_Var90 >> 8),1),
                  pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar100 = vandps_avx(auVar20,auVar100);
            fVar132 = 1.0 / auVar103._0_4_;
            local_2a0[0] = fVar132 * ((float)local_3e0._0_4_ + 0.0);
            local_2a0[1] = fVar132 * ((float)local_3e0._4_4_ + 1.0);
            local_2a0[2] = fVar132 * (fStack_3d8 + 2.0);
            local_2a0[3] = fVar132 * (fStack_3d4 + 3.0);
            fStack_290 = fVar132 * (fStack_3d0 + 4.0);
            fStack_28c = fVar132 * (fStack_3cc + 5.0);
            fStack_288 = fVar132 * (fStack_3c8 + 6.0);
            fStack_284 = fStack_3c4 + 7.0;
            local_520._0_8_ = auVar11._0_8_;
            local_520._8_8_ = auVar11._8_8_;
            local_280 = local_520._0_8_;
            uStack_278 = local_520._8_8_;
            uStack_270 = 0;
            uStack_268 = 0;
            local_260 = local_400;
            uVar89 = vmovmskps_avx(auVar100);
            uVar83 = 0;
            uVar85 = CONCAT44((int)((ulong)p_Var90 >> 0x20),uVar89);
            for (uVar21 = uVar85; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              uVar83 = uVar83 + 1;
            }
            local_680._4_4_ = uVar86;
            local_680._0_4_ = uVar86;
            local_680._8_4_ = uVar86;
            local_680._12_4_ = uVar86;
            local_680._16_4_ = uVar86;
            local_680._20_4_ = uVar86;
            local_680._24_4_ = uVar86;
            local_680._28_4_ = uVar86;
            local_6a0._0_4_ = local_6a0._4_4_;
            local_6a0._8_4_ = local_6a0._4_4_;
            local_6a0._12_4_ = local_6a0._4_4_;
            local_6a0._16_4_ = local_6a0._4_4_;
            local_6a0._20_4_ = local_6a0._4_4_;
            local_6a0._24_4_ = local_6a0._4_4_;
            local_6a0._28_4_ = local_6a0._4_4_;
            auVar100 = vpcmpeqd_avx2(auVar140,auVar140);
            auVar156 = ZEXT3264(auVar100);
            local_6e0 = auVar204;
            local_31c = iVar81;
            while (auVar204 = auVar207._0_32_, uVar85 != 0) {
              uVar89 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_1e0 = local_2a0[uVar83];
              local_1c0 = *(undefined4 *)((long)&local_280 + uVar83 * 4);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar83 * 4);
              fVar114 = 1.0 - local_1e0;
              auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                        ZEXT416((uint)(local_1e0 * fVar114)),ZEXT416(0xc0000000));
              auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar114)),
                                        ZEXT416((uint)(local_1e0 * local_1e0)),ZEXT416(0x40000000));
              fVar132 = auVar11._0_4_ * 3.0;
              fVar112 = local_1e0 * local_1e0 * 3.0;
              auVar162._0_4_ = fVar112 * (float)local_5b0._0_4_;
              auVar162._4_4_ = fVar112 * (float)local_5b0._4_4_;
              auVar162._8_4_ = fVar112 * fStack_5a8;
              auVar162._12_4_ = fVar112 * fStack_5a4;
              auVar136._4_4_ = fVar132;
              auVar136._0_4_ = fVar132;
              auVar136._8_4_ = fVar132;
              auVar136._12_4_ = fVar132;
              auVar11 = vfmadd132ps_fma(auVar136,auVar162,auVar17);
              fVar132 = auVar14._0_4_ * 3.0;
              auVar153._4_4_ = fVar132;
              auVar153._0_4_ = fVar132;
              auVar153._8_4_ = fVar132;
              auVar153._12_4_ = fVar132;
              auVar11 = vfmadd132ps_fma(auVar153,auVar11,auVar122);
              fVar132 = fVar114 * fVar114 * -3.0;
              local_710.context = context->user;
              auVar137._4_4_ = fVar132;
              auVar137._0_4_ = fVar132;
              auVar137._8_4_ = fVar132;
              auVar137._12_4_ = fVar132;
              auVar14 = vfmadd132ps_fma(auVar137,auVar11,local_6b0);
              local_240 = auVar14._0_4_;
              uStack_23c = local_240;
              uStack_238 = local_240;
              uStack_234 = local_240;
              uStack_230 = local_240;
              uStack_22c = local_240;
              uStack_228 = local_240;
              uStack_224 = local_240;
              auVar11 = vmovshdup_avx(auVar14);
              local_220 = auVar11._0_8_;
              uStack_218 = local_220;
              uStack_210 = local_220;
              uStack_208 = local_220;
              auVar11 = vshufps_avx(auVar14,auVar14,0xaa);
              local_200 = auVar11._0_8_;
              uStack_1f8 = local_200;
              uStack_1f0 = local_200;
              uStack_1e8 = local_200;
              fStack_1dc = local_1e0;
              fStack_1d8 = local_1e0;
              fStack_1d4 = local_1e0;
              fStack_1d0 = local_1e0;
              fStack_1cc = local_1e0;
              fStack_1c8 = local_1e0;
              fStack_1c4 = local_1e0;
              uStack_1bc = local_1c0;
              uStack_1b8 = local_1c0;
              uStack_1b4 = local_1c0;
              uStack_1b0 = local_1c0;
              uStack_1ac = local_1c0;
              uStack_1a8 = local_1c0;
              uStack_1a4 = local_1c0;
              local_1a0 = local_6a0._0_8_;
              uStack_198 = local_6a0._8_8_;
              uStack_190 = local_6a0._16_8_;
              uStack_188 = local_6a0._24_8_;
              local_180 = local_680._0_8_;
              uStack_178 = local_680._8_8_;
              uStack_170 = local_680._16_8_;
              uStack_168 = local_680._24_8_;
              local_160 = (local_710.context)->instID[0];
              uStack_15c = local_160;
              uStack_158 = local_160;
              uStack_154 = local_160;
              uStack_150 = local_160;
              uStack_14c = local_160;
              uStack_148 = local_160;
              uStack_144 = local_160;
              local_140 = (local_710.context)->instPrimID[0];
              uStack_13c = local_140;
              uStack_138 = local_140;
              uStack_134 = local_140;
              uStack_130 = local_140;
              uStack_12c = local_140;
              uStack_128 = local_140;
              uStack_124 = local_140;
              local_660 = local_420;
              local_710.valid = (int *)local_660;
              local_710.geometryUserPtr = pGVar8->userPtr;
              local_710.hit = (RTCHitN *)&local_240;
              local_710.N = 8;
              local_710.ray = (RTCRayN *)ray;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar100 = ZEXT1632(auVar156._0_16_);
                (*pGVar8->occlusionFilterN)(&local_710);
                auVar207 = ZEXT3264(local_6e0);
                auVar100 = vpcmpeqd_avx2(auVar100,auVar100);
                auVar156 = ZEXT3264(auVar100);
                auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar20 = vpcmpeqd_avx2(auVar192._0_32_,local_660);
              auVar100 = auVar156._0_32_ & ~auVar20;
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar100 >> 0x7f,0) == '\0') &&
                    (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0xbf,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar100[0x1f]) {
                auVar20 = auVar20 ^ auVar156._0_32_;
              }
              else {
                p_Var90 = context->args->filter;
                if ((p_Var90 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar100 = ZEXT1632(auVar156._0_16_);
                  (*p_Var90)(&local_710);
                  auVar207 = ZEXT3264(local_6e0);
                  auVar100 = vpcmpeqd_avx2(auVar100,auVar100);
                  auVar156 = ZEXT3264(auVar100);
                  auVar192 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar100 = vpcmpeqd_avx2(auVar192._0_32_,local_660);
                auVar20 = auVar100 ^ auVar156._0_32_;
                auVar143._8_4_ = 0xff800000;
                auVar143._0_8_ = 0xff800000ff800000;
                auVar143._12_4_ = 0xff800000;
                auVar143._16_4_ = 0xff800000;
                auVar143._20_4_ = 0xff800000;
                auVar143._24_4_ = 0xff800000;
                auVar143._28_4_ = 0xff800000;
                auVar100 = vblendvps_avx(auVar143,*(undefined1 (*) [32])(local_710.ray + 0x100),
                                         auVar100);
                *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar100;
              }
              auVar204 = auVar207._0_32_;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                p_Var90 = (RTCFilterFunctionN)0x1;
                goto LAB_01155b11;
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar89;
              uVar21 = uVar83 & 0x3f;
              uVar83 = 0;
              uVar85 = uVar85 ^ 1L << uVar21;
              for (uVar21 = uVar85; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                uVar83 = uVar83 + 1;
              }
            }
            p_Var90 = (RTCFilterFunctionN)0x0;
          }
LAB_01155b11:
        }
      }
    }
    auVar197 = ZEXT3264(auVar197._0_32_);
    auVar195 = ZEXT3264(auVar195._0_32_);
    if (8 < iVar81) {
      local_500._4_4_ = fVar133;
      local_500._0_4_ = fVar133;
      fStack_4f8 = fVar133;
      fStack_4f4 = fVar133;
      fStack_4f0 = fVar133;
      fStack_4ec = fVar133;
      fStack_4e8 = fVar133;
      fStack_4e4 = fVar133;
      local_e0 = uVar91;
      uStack_dc = uVar91;
      uStack_d8 = uVar91;
      uStack_d4 = uVar91;
      uStack_d0 = uVar91;
      uStack_cc = uVar91;
      uStack_c8 = uVar91;
      uStack_c4 = uVar91;
      local_120 = 1.0 / (float)local_580._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_100 = uVar86;
      uStack_fc = uVar86;
      uStack_f8 = uVar86;
      uStack_f4 = uVar86;
      uStack_f0 = uVar86;
      uStack_ec = uVar86;
      uStack_e8 = uVar86;
      uStack_e4 = uVar86;
      local_5a0._4_4_ = local_5a0._0_4_;
      local_5a0._8_4_ = local_5a0._0_4_;
      local_5a0._12_4_ = local_5a0._0_4_;
      uStack_590 = local_5a0._0_4_;
      uStack_58c = local_5a0._0_4_;
      uStack_588 = local_5a0._0_4_;
      uStack_584 = local_5a0._0_4_;
      local_6e0 = auVar204;
      local_4e0 = (float)iVar81;
      fStack_4dc = (float)iVar81;
      fStack_4d8 = (float)iVar81;
      fStack_4d4 = (float)iVar81;
      fStack_4d0 = (float)iVar81;
      fStack_4cc = (float)iVar81;
      fStack_4c8 = (float)iVar81;
      iStack_4c4 = iVar81;
      for (lVar87 = 8; lVar87 < iVar81; lVar87 = lVar87 + 8) {
        auVar102 = auVar195._0_32_;
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar92);
        auVar20 = *(undefined1 (*) [32])(lVar92 + 0x21fb768 + lVar87 * 4);
        auVar124 = *(undefined1 (*) [32])(lVar92 + 0x21fbbec + lVar87 * 4);
        pauVar1 = (undefined1 (*) [28])(lVar92 + 0x21fc070 + lVar87 * 4);
        auVar77 = *pauVar1;
        auVar192._0_4_ = fVar174 * *(float *)*pauVar1;
        auVar192._4_4_ = fVar174 * *(float *)(*pauVar1 + 4);
        auVar192._8_4_ = fVar174 * *(float *)(*pauVar1 + 8);
        auVar192._12_4_ = fVar174 * *(float *)(*pauVar1 + 0xc);
        auVar192._16_4_ = fVar174 * *(float *)(*pauVar1 + 0x10);
        auVar192._20_4_ = fVar174 * *(float *)(*pauVar1 + 0x14);
        auVar192._28_36_ = auVar195._28_36_;
        auVar192._24_4_ = fVar174 * *(float *)(*pauVar1 + 0x18);
        auVar40._4_4_ = fVar115 * *(float *)(*pauVar1 + 4);
        auVar40._0_4_ = fVar111 * *(float *)*pauVar1;
        auVar40._8_4_ = fVar111 * *(float *)(*pauVar1 + 8);
        auVar40._12_4_ = fVar115 * *(float *)(*pauVar1 + 0xc);
        auVar40._16_4_ = fVar111 * *(float *)(*pauVar1 + 0x10);
        auVar40._20_4_ = fVar115 * *(float *)(*pauVar1 + 0x14);
        auVar40._24_4_ = fVar111 * *(float *)(*pauVar1 + 0x18);
        auVar40._28_4_ = *(undefined4 *)pauVar1[1];
        auVar11 = vfmadd231ps_fma(auVar192._0_32_,auVar124,auVar140);
        auVar14 = vfmadd231ps_fma(auVar40,auVar124,auVar198);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar20,auVar164);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar20,local_5e0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar100,auVar180);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar100,local_600);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar92);
        auVar129 = *(undefined1 (*) [32])(lVar92 + 0x21fdb88 + lVar87 * 4);
        auVar6 = *(undefined1 (*) [32])(lVar92 + 0x21fe00c + lVar87 * 4);
        pfVar2 = (float *)(lVar92 + 0x21fe490 + lVar87 * 4);
        fVar119 = *pfVar2;
        fVar69 = pfVar2[1];
        fVar70 = pfVar2[2];
        fVar71 = pfVar2[3];
        fVar72 = pfVar2[4];
        fVar73 = pfVar2[5];
        fVar74 = pfVar2[6];
        auVar41._4_4_ = fVar174 * fVar69;
        auVar41._0_4_ = fVar174 * fVar119;
        auVar41._8_4_ = fVar174 * fVar70;
        auVar41._12_4_ = fVar174 * fVar71;
        auVar41._16_4_ = fVar174 * fVar72;
        auVar41._20_4_ = fVar174 * fVar73;
        auVar41._24_4_ = fVar174 * fVar74;
        auVar41._28_4_ = local_600._28_4_;
        auVar78._4_4_ = fVar115 * fVar69;
        auVar78._0_4_ = fVar111 * fVar119;
        auVar78._8_4_ = fVar111 * fVar70;
        auVar78._12_4_ = fVar115 * fVar71;
        auVar78._16_4_ = fVar111 * fVar72;
        auVar78._20_4_ = fVar115 * fVar73;
        auVar78._24_4_ = fVar111 * fVar74;
        auVar78._28_4_ = uVar184;
        auVar15 = vfmadd231ps_fma(auVar41,auVar6,auVar140);
        auVar16 = vfmadd231ps_fma(auVar78,auVar6,auVar198);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar129,auVar164);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_5e0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar108,auVar180);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar108,local_600);
        local_4a0 = ZEXT1632(auVar15);
        local_6a0 = ZEXT1632(auVar11);
        local_4c0 = vsubps_avx(local_4a0,local_6a0);
        local_480 = ZEXT1632(auVar16);
        local_680 = ZEXT1632(auVar14);
        local_460 = vsubps_avx(local_480,local_680);
        auVar109._0_4_ = auVar14._0_4_ * local_4c0._0_4_;
        auVar109._4_4_ = auVar14._4_4_ * local_4c0._4_4_;
        auVar109._8_4_ = auVar14._8_4_ * local_4c0._8_4_;
        auVar109._12_4_ = auVar14._12_4_ * local_4c0._12_4_;
        auVar109._16_4_ = local_4c0._16_4_ * 0.0;
        auVar109._20_4_ = local_4c0._20_4_ * 0.0;
        auVar109._24_4_ = local_4c0._24_4_ * 0.0;
        auVar109._28_4_ = 0;
        fVar133 = local_460._0_4_;
        fVar132 = local_460._4_4_;
        auVar79._4_4_ = auVar11._4_4_ * fVar132;
        auVar79._0_4_ = auVar11._0_4_ * fVar133;
        fVar112 = local_460._8_4_;
        auVar79._8_4_ = auVar11._8_4_ * fVar112;
        fVar114 = local_460._12_4_;
        auVar79._12_4_ = auVar11._12_4_ * fVar114;
        fVar116 = local_460._16_4_;
        auVar79._16_4_ = fVar116 * 0.0;
        fVar117 = local_460._20_4_;
        auVar79._20_4_ = fVar117 * 0.0;
        fVar118 = local_460._24_4_;
        auVar79._24_4_ = fVar118 * 0.0;
        auVar79._28_4_ = auVar12._4_4_;
        auVar13 = vsubps_avx(auVar109,auVar79);
        local_920 = auVar77._0_4_;
        fStack_91c = auVar77._4_4_;
        fStack_918 = auVar77._8_4_;
        fStack_914 = auVar77._12_4_;
        fStack_910 = auVar77._16_4_;
        fStack_90c = auVar77._20_4_;
        fStack_908 = auVar77._24_4_;
        auVar80._4_4_ = (float)local_3c0._4_4_ * fStack_91c;
        auVar80._0_4_ = (float)local_3c0._0_4_ * local_920;
        auVar80._8_4_ = fStack_3b8 * fStack_918;
        auVar80._12_4_ = fStack_3b4 * fStack_914;
        auVar80._16_4_ = fStack_3b0 * fStack_910;
        auVar80._20_4_ = fStack_3ac * fStack_90c;
        auVar80._24_4_ = fStack_3a8 * fStack_908;
        auVar80._28_4_ = auVar164._0_4_;
        auVar11 = vfmadd231ps_fma(auVar80,auVar124,local_a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_80,auVar20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_3a0,auVar100);
        auVar42._4_4_ = (float)local_3c0._4_4_ * fVar69;
        auVar42._0_4_ = (float)local_3c0._0_4_ * fVar119;
        auVar42._8_4_ = fStack_3b8 * fVar70;
        auVar42._12_4_ = fStack_3b4 * fVar71;
        auVar42._16_4_ = fStack_3b0 * fVar72;
        auVar42._20_4_ = fStack_3ac * fVar73;
        auVar42._24_4_ = fStack_3a8 * fVar74;
        auVar42._28_4_ = uStack_3a4;
        auVar14 = vfmadd231ps_fma(auVar42,auVar6,local_a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar129,local_80);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar108,local_3a0);
        auVar43._4_4_ = fVar132 * fVar132;
        auVar43._0_4_ = fVar133 * fVar133;
        auVar43._8_4_ = fVar112 * fVar112;
        auVar43._12_4_ = fVar114 * fVar114;
        auVar43._16_4_ = fVar116 * fVar116;
        auVar43._20_4_ = fVar117 * fVar117;
        auVar43._24_4_ = fVar118 * fVar118;
        auVar43._28_4_ = local_3a0._28_4_;
        auVar15 = vfmadd231ps_fma(auVar43,local_4c0,local_4c0);
        auVar201 = ZEXT1632(auVar11);
        auVar166 = vmaxps_avx(auVar201,ZEXT1632(auVar14));
        auVar189._0_4_ = auVar166._0_4_ * auVar166._0_4_ * auVar15._0_4_;
        auVar189._4_4_ = auVar166._4_4_ * auVar166._4_4_ * auVar15._4_4_;
        auVar189._8_4_ = auVar166._8_4_ * auVar166._8_4_ * auVar15._8_4_;
        auVar189._12_4_ = auVar166._12_4_ * auVar166._12_4_ * auVar15._12_4_;
        auVar189._16_4_ = auVar166._16_4_ * auVar166._16_4_ * 0.0;
        auVar189._20_4_ = auVar166._20_4_ * auVar166._20_4_ * 0.0;
        auVar189._24_4_ = auVar166._24_4_ * auVar166._24_4_ * 0.0;
        auVar189._28_4_ = 0;
        auVar44._4_4_ = auVar13._4_4_ * auVar13._4_4_;
        auVar44._0_4_ = auVar13._0_4_ * auVar13._0_4_;
        auVar44._8_4_ = auVar13._8_4_ * auVar13._8_4_;
        auVar44._12_4_ = auVar13._12_4_ * auVar13._12_4_;
        auVar44._16_4_ = auVar13._16_4_ * auVar13._16_4_;
        auVar44._20_4_ = auVar13._20_4_ * auVar13._20_4_;
        auVar44._24_4_ = auVar13._24_4_ * auVar13._24_4_;
        auVar44._28_4_ = auVar13._28_4_;
        auVar166 = vcmpps_avx(auVar44,auVar189,2);
        local_320 = (int)lVar87;
        auVar190._4_4_ = local_320;
        auVar190._0_4_ = local_320;
        auVar190._8_4_ = local_320;
        auVar190._12_4_ = local_320;
        auVar190._16_4_ = local_320;
        auVar190._20_4_ = local_320;
        auVar190._24_4_ = local_320;
        auVar190._28_4_ = local_320;
        auVar13 = vpor_avx2(auVar190,_DAT_01fb4ba0);
        auVar75._4_4_ = fStack_4dc;
        auVar75._0_4_ = local_4e0;
        auVar75._8_4_ = fStack_4d8;
        auVar75._12_4_ = fStack_4d4;
        auVar75._16_4_ = fStack_4d0;
        auVar75._20_4_ = fStack_4cc;
        auVar75._24_4_ = fStack_4c8;
        auVar75._28_4_ = iStack_4c4;
        auVar110 = vpcmpgtd_avx2(auVar75,auVar13);
        auVar13 = auVar110 & auVar166;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar13 >> 0x7f,0) == '\0') &&
              (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0xbf,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar13[0x1f]) {
          auVar195 = ZEXT3264(auVar102);
        }
        else {
          local_580 = vandps_avx(auVar110,auVar166);
          auVar45._4_4_ = fVar69 * fVar183;
          auVar45._0_4_ = fVar119 * fVar113;
          auVar45._8_4_ = fVar70 * fVar113;
          auVar45._12_4_ = fVar71 * fVar183;
          auVar45._16_4_ = fVar72 * fVar113;
          auVar45._20_4_ = fVar73 * fVar183;
          auVar45._24_4_ = fVar74 * fVar113;
          auVar45._28_4_ = auVar166._28_4_;
          auVar11 = vfmadd213ps_fma(auVar6,local_560,auVar45);
          auVar11 = vfmadd213ps_fma(auVar129,local_c0,ZEXT1632(auVar11));
          auVar11 = vfmadd132ps_fma(auVar108,ZEXT1632(auVar11),local_6e0);
          auVar46._4_4_ = fVar183 * fStack_91c;
          auVar46._0_4_ = fVar113 * local_920;
          auVar46._8_4_ = fVar113 * fStack_918;
          auVar46._12_4_ = fVar183 * fStack_914;
          auVar46._16_4_ = fVar113 * fStack_910;
          auVar46._20_4_ = fVar183 * fStack_90c;
          auVar46._24_4_ = fVar113 * fStack_908;
          auVar46._28_4_ = auVar166._28_4_;
          auVar15 = vfmadd213ps_fma(auVar124,local_560,auVar46);
          auVar15 = vfmadd213ps_fma(auVar20,local_c0,ZEXT1632(auVar15));
          auVar20 = *(undefined1 (*) [32])(lVar92 + 0x21fc4f4 + lVar87 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar92 + 0x21fc978 + lVar87 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar92 + 0x21fcdfc + lVar87 * 4);
          pfVar3 = (float *)(lVar92 + 0x21fd280 + lVar87 * 4);
          fVar133 = *pfVar3;
          fVar132 = pfVar3[1];
          fVar112 = pfVar3[2];
          fVar114 = pfVar3[3];
          fVar116 = pfVar3[4];
          fVar117 = pfVar3[5];
          fVar118 = pfVar3[6];
          auVar181._0_4_ = fVar133 * fVar174;
          auVar181._4_4_ = fVar132 * fVar174;
          auVar181._8_4_ = fVar112 * fVar174;
          auVar181._12_4_ = fVar114 * fVar174;
          auVar181._16_4_ = fVar116 * fVar174;
          auVar181._20_4_ = fVar117 * fVar174;
          auVar181._24_4_ = fVar118 * fVar174;
          auVar181._28_4_ = 0;
          auVar47._4_4_ = fVar115 * fVar132;
          auVar47._0_4_ = fVar111 * fVar133;
          auVar47._8_4_ = fVar111 * fVar112;
          auVar47._12_4_ = fVar115 * fVar114;
          auVar47._16_4_ = fVar111 * fVar116;
          auVar47._20_4_ = fVar115 * fVar117;
          auVar47._24_4_ = fVar111 * fVar118;
          auVar47._28_4_ = pfVar2[7];
          auVar48._4_4_ = fVar132 * fVar183;
          auVar48._0_4_ = fVar133 * fVar113;
          auVar48._8_4_ = fVar112 * fVar113;
          auVar48._12_4_ = fVar114 * fVar183;
          auVar48._16_4_ = fVar116 * fVar113;
          auVar48._20_4_ = fVar117 * fVar183;
          auVar48._24_4_ = fVar118 * fVar113;
          auVar48._28_4_ = pfVar3[7];
          auVar16 = vfmadd231ps_fma(auVar181,auVar108,auVar140);
          auVar97 = vfmadd231ps_fma(auVar47,auVar108,auVar198);
          auVar96 = vfmadd231ps_fma(auVar48,local_560,auVar108);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,auVar164);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar124,local_5e0);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_c0,auVar124);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar20,auVar180);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar20,local_600);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar20,local_6e0);
          pfVar2 = (float *)(lVar92 + 0x21ff6a0 + lVar87 * 4);
          fVar133 = *pfVar2;
          fVar132 = pfVar2[1];
          fVar112 = pfVar2[2];
          fVar114 = pfVar2[3];
          fVar116 = pfVar2[4];
          fVar117 = pfVar2[5];
          fVar118 = pfVar2[6];
          auVar205._0_4_ = fVar174 * fVar133;
          auVar205._4_4_ = fVar174 * fVar132;
          auVar205._8_4_ = fVar174 * fVar112;
          auVar205._12_4_ = fVar174 * fVar114;
          auVar205._16_4_ = fVar174 * fVar116;
          auVar205._20_4_ = fVar174 * fVar117;
          auVar205._24_4_ = fVar174 * fVar118;
          auVar205._28_4_ = 0;
          auVar49._4_4_ = fVar115 * fVar132;
          auVar49._0_4_ = fVar111 * fVar133;
          auVar49._8_4_ = fVar111 * fVar112;
          auVar49._12_4_ = fVar115 * fVar114;
          auVar49._16_4_ = fVar111 * fVar116;
          auVar49._20_4_ = fVar115 * fVar117;
          auVar49._24_4_ = fVar111 * fVar118;
          auVar49._28_4_ = fVar115;
          auVar50._4_4_ = fVar132 * fVar183;
          auVar50._0_4_ = fVar133 * fVar113;
          auVar50._8_4_ = fVar112 * fVar113;
          auVar50._12_4_ = fVar114 * fVar183;
          auVar50._16_4_ = fVar116 * fVar113;
          auVar50._20_4_ = fVar117 * fVar183;
          auVar50._24_4_ = fVar118 * fVar113;
          auVar50._28_4_ = pfVar2[7];
          auVar20 = *(undefined1 (*) [32])(lVar92 + 0x21ff21c + lVar87 * 4);
          auVar134 = vfmadd231ps_fma(auVar205,auVar20,auVar140);
          auVar121 = vfmadd231ps_fma(auVar49,auVar20,auVar198);
          auVar95 = vfmadd231ps_fma(auVar50,local_560,auVar20);
          auVar20 = *(undefined1 (*) [32])(lVar92 + 0x21fed98 + lVar87 * 4);
          auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar20,auVar164);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar20,local_5e0);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_c0,auVar20);
          auVar20 = *(undefined1 (*) [32])(lVar92 + 0x21fe914 + lVar87 * 4);
          auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar20,auVar180);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar20,local_600);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_6e0,auVar20);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar191._16_4_ = 0x7fffffff;
          auVar191._20_4_ = 0x7fffffff;
          auVar191._24_4_ = 0x7fffffff;
          auVar191._28_4_ = 0x7fffffff;
          auVar20 = vandps_avx(ZEXT1632(auVar16),auVar191);
          auVar124 = vandps_avx(ZEXT1632(auVar97),auVar191);
          auVar124 = vmaxps_avx(auVar20,auVar124);
          auVar20 = vandps_avx(ZEXT1632(auVar96),auVar191);
          auVar20 = vmaxps_avx(auVar124,auVar20);
          auVar20 = vcmpps_avx(auVar20,_local_500,1);
          auVar108 = vblendvps_avx(ZEXT1632(auVar16),local_4c0,auVar20);
          auVar129 = vblendvps_avx(ZEXT1632(auVar97),local_460,auVar20);
          auVar20 = vandps_avx(ZEXT1632(auVar134),auVar191);
          auVar124 = vandps_avx(ZEXT1632(auVar121),auVar191);
          auVar124 = vmaxps_avx(auVar20,auVar124);
          auVar20 = vandps_avx(auVar191,ZEXT1632(auVar95));
          auVar20 = vmaxps_avx(auVar124,auVar20);
          auVar124 = vcmpps_avx(auVar20,_local_500,1);
          auVar20 = vblendvps_avx(ZEXT1632(auVar134),local_4c0,auVar124);
          auVar124 = vblendvps_avx(ZEXT1632(auVar121),local_460,auVar124);
          auVar15 = vfmadd213ps_fma(auVar100,local_6e0,ZEXT1632(auVar15));
          auVar16 = vfmadd213ps_fma(auVar108,auVar108,ZEXT832(0) << 0x20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,auVar129);
          auVar100 = vrsqrtps_avx(ZEXT1632(auVar16));
          fVar133 = auVar100._0_4_;
          fVar132 = auVar100._4_4_;
          fVar112 = auVar100._8_4_;
          fVar114 = auVar100._12_4_;
          fVar116 = auVar100._16_4_;
          fVar117 = auVar100._20_4_;
          fVar118 = auVar100._24_4_;
          auVar51._4_4_ = fVar132 * fVar132 * fVar132 * auVar16._4_4_ * -0.5;
          auVar51._0_4_ = fVar133 * fVar133 * fVar133 * auVar16._0_4_ * -0.5;
          auVar51._8_4_ = fVar112 * fVar112 * fVar112 * auVar16._8_4_ * -0.5;
          auVar51._12_4_ = fVar114 * fVar114 * fVar114 * auVar16._12_4_ * -0.5;
          auVar51._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar51._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar51._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
          auVar51._28_4_ = 0;
          auVar206._8_4_ = 0x3fc00000;
          auVar206._0_8_ = 0x3fc000003fc00000;
          auVar206._12_4_ = 0x3fc00000;
          auVar206._16_4_ = 0x3fc00000;
          auVar206._20_4_ = 0x3fc00000;
          auVar206._24_4_ = 0x3fc00000;
          auVar206._28_4_ = 0x3fc00000;
          auVar16 = vfmadd231ps_fma(auVar51,auVar206,auVar100);
          fVar133 = auVar16._0_4_;
          fVar132 = auVar16._4_4_;
          auVar52._4_4_ = auVar129._4_4_ * fVar132;
          auVar52._0_4_ = auVar129._0_4_ * fVar133;
          fVar112 = auVar16._8_4_;
          auVar52._8_4_ = auVar129._8_4_ * fVar112;
          fVar114 = auVar16._12_4_;
          auVar52._12_4_ = auVar129._12_4_ * fVar114;
          auVar52._16_4_ = auVar129._16_4_ * 0.0;
          auVar52._20_4_ = auVar129._20_4_ * 0.0;
          auVar52._24_4_ = auVar129._24_4_ * 0.0;
          auVar52._28_4_ = auVar100._28_4_;
          auVar53._4_4_ = fVar132 * -auVar108._4_4_;
          auVar53._0_4_ = fVar133 * -auVar108._0_4_;
          auVar53._8_4_ = fVar112 * -auVar108._8_4_;
          auVar53._12_4_ = fVar114 * -auVar108._12_4_;
          auVar53._16_4_ = -auVar108._16_4_ * 0.0;
          auVar53._20_4_ = -auVar108._20_4_ * 0.0;
          auVar53._24_4_ = -auVar108._24_4_ * 0.0;
          auVar53._28_4_ = auVar129._28_4_;
          auVar16 = vfmadd213ps_fma(auVar20,auVar20,ZEXT832(0) << 0x20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar124,auVar124);
          auVar100 = vrsqrtps_avx(ZEXT1632(auVar16));
          auVar54._28_4_ = local_600._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * 0.0,
                                  CONCAT48(fVar112 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0))));
          fVar133 = auVar100._0_4_;
          fVar132 = auVar100._4_4_;
          fVar112 = auVar100._8_4_;
          fVar114 = auVar100._12_4_;
          fVar116 = auVar100._16_4_;
          fVar117 = auVar100._20_4_;
          fVar118 = auVar100._24_4_;
          auVar55._4_4_ = fVar132 * fVar132 * fVar132 * auVar16._4_4_ * -0.5;
          auVar55._0_4_ = fVar133 * fVar133 * fVar133 * auVar16._0_4_ * -0.5;
          auVar55._8_4_ = fVar112 * fVar112 * fVar112 * auVar16._8_4_ * -0.5;
          auVar55._12_4_ = fVar114 * fVar114 * fVar114 * auVar16._12_4_ * -0.5;
          auVar55._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar55._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar55._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
          auVar55._28_4_ = 0;
          auVar16 = vfmadd231ps_fma(auVar55,auVar206,auVar100);
          fVar133 = auVar16._0_4_;
          fVar132 = auVar16._4_4_;
          auVar56._4_4_ = auVar124._4_4_ * fVar132;
          auVar56._0_4_ = auVar124._0_4_ * fVar133;
          fVar112 = auVar16._8_4_;
          auVar56._8_4_ = auVar124._8_4_ * fVar112;
          fVar114 = auVar16._12_4_;
          auVar56._12_4_ = auVar124._12_4_ * fVar114;
          auVar56._16_4_ = auVar124._16_4_ * 0.0;
          auVar56._20_4_ = auVar124._20_4_ * 0.0;
          auVar56._24_4_ = auVar124._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = fVar132 * -auVar20._4_4_;
          auVar57._0_4_ = fVar133 * -auVar20._0_4_;
          auVar57._8_4_ = fVar112 * -auVar20._8_4_;
          auVar57._12_4_ = fVar114 * -auVar20._12_4_;
          auVar57._16_4_ = -auVar20._16_4_ * 0.0;
          auVar57._20_4_ = -auVar20._20_4_ * 0.0;
          auVar57._24_4_ = -auVar20._24_4_ * 0.0;
          auVar57._28_4_ = auVar100._28_4_;
          auVar58._28_4_ = 0xbf000000;
          auVar58._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * 0.0,
                                  CONCAT48(fVar112 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0))));
          auVar16 = vfmadd213ps_fma(auVar52,auVar201,local_6a0);
          auVar97 = vfmadd213ps_fma(auVar53,auVar201,local_680);
          auVar96 = vfmadd213ps_fma(auVar54,auVar201,ZEXT1632(auVar15));
          auVar95 = vfnmadd213ps_fma(auVar52,auVar201,local_6a0);
          auVar134 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar14),local_4a0);
          auVar146 = vfnmadd213ps_fma(auVar53,auVar201,local_680);
          auVar125 = ZEXT1632(auVar14);
          auVar14 = vfmadd213ps_fma(auVar57,auVar125,local_480);
          auVar120 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar201,auVar54);
          auVar15 = vfmadd213ps_fma(auVar58,auVar125,ZEXT1632(auVar11));
          auVar152 = vfnmadd213ps_fma(auVar56,auVar125,local_4a0);
          auVar94 = vfnmadd213ps_fma(auVar57,auVar125,local_480);
          auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar58);
          auVar100 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar146));
          auVar20 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar120));
          auVar59._4_4_ = auVar100._4_4_ * auVar120._4_4_;
          auVar59._0_4_ = auVar100._0_4_ * auVar120._0_4_;
          auVar59._8_4_ = auVar100._8_4_ * auVar120._8_4_;
          auVar59._12_4_ = auVar100._12_4_ * auVar120._12_4_;
          auVar59._16_4_ = auVar100._16_4_ * 0.0;
          auVar59._20_4_ = auVar100._20_4_ * 0.0;
          auVar59._24_4_ = auVar100._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar121 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar146),auVar20);
          auVar60._4_4_ = auVar95._4_4_ * auVar20._4_4_;
          auVar60._0_4_ = auVar95._0_4_ * auVar20._0_4_;
          auVar60._8_4_ = auVar95._8_4_ * auVar20._8_4_;
          auVar60._12_4_ = auVar95._12_4_ * auVar20._12_4_;
          auVar60._16_4_ = auVar20._16_4_ * 0.0;
          auVar60._20_4_ = auVar20._20_4_ * 0.0;
          auVar60._24_4_ = auVar20._24_4_ * 0.0;
          auVar60._28_4_ = auVar20._28_4_;
          auVar166 = ZEXT1632(auVar95);
          auVar20 = vsubps_avx(ZEXT1632(auVar134),auVar166);
          auVar110 = ZEXT1632(auVar120);
          auVar11 = vfmsub231ps_fma(auVar60,auVar110,auVar20);
          auVar61._4_4_ = auVar146._4_4_ * auVar20._4_4_;
          auVar61._0_4_ = auVar146._0_4_ * auVar20._0_4_;
          auVar61._8_4_ = auVar146._8_4_ * auVar20._8_4_;
          auVar61._12_4_ = auVar146._12_4_ * auVar20._12_4_;
          auVar61._16_4_ = auVar20._16_4_ * 0.0;
          auVar61._20_4_ = auVar20._20_4_ * 0.0;
          auVar61._24_4_ = auVar20._24_4_ * 0.0;
          auVar61._28_4_ = auVar20._28_4_;
          auVar95 = vfmsub231ps_fma(auVar61,auVar166,auVar100);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar121));
          auVar10 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
          auVar100 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar16),auVar10);
          auVar20 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar97),auVar10);
          auVar124 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar96),auVar10);
          auVar108 = vblendvps_avx(auVar166,ZEXT1632(auVar134),auVar10);
          auVar129 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar14),auVar10);
          auVar6 = vblendvps_avx(auVar110,ZEXT1632(auVar15),auVar10);
          auVar166 = vblendvps_avx(ZEXT1632(auVar134),auVar166,auVar10);
          auVar13 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar146),auVar10);
          auVar11 = vpackssdw_avx(local_580._0_16_,local_580._16_16_);
          auVar110 = vblendvps_avx(ZEXT1632(auVar15),auVar110,auVar10);
          auVar166 = vsubps_avx(auVar166,auVar100);
          auVar13 = vsubps_avx(auVar13,auVar20);
          auVar18 = vsubps_avx(auVar110,auVar124);
          auVar19 = vsubps_avx(auVar100,auVar108);
          auVar101 = vsubps_avx(auVar20,auVar129);
          auVar103 = vsubps_avx(auVar124,auVar6);
          auVar167._0_4_ = auVar18._0_4_ * auVar100._0_4_;
          auVar167._4_4_ = auVar18._4_4_ * auVar100._4_4_;
          auVar167._8_4_ = auVar18._8_4_ * auVar100._8_4_;
          auVar167._12_4_ = auVar18._12_4_ * auVar100._12_4_;
          auVar167._16_4_ = auVar18._16_4_ * auVar100._16_4_;
          auVar167._20_4_ = auVar18._20_4_ * auVar100._20_4_;
          auVar167._24_4_ = auVar18._24_4_ * auVar100._24_4_;
          auVar167._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar167,auVar124,auVar166);
          auVar62._4_4_ = auVar166._4_4_ * auVar20._4_4_;
          auVar62._0_4_ = auVar166._0_4_ * auVar20._0_4_;
          auVar62._8_4_ = auVar166._8_4_ * auVar20._8_4_;
          auVar62._12_4_ = auVar166._12_4_ * auVar20._12_4_;
          auVar62._16_4_ = auVar166._16_4_ * auVar20._16_4_;
          auVar62._20_4_ = auVar166._20_4_ * auVar20._20_4_;
          auVar62._24_4_ = auVar166._24_4_ * auVar20._24_4_;
          auVar62._28_4_ = auVar110._28_4_;
          auVar15 = vfmsub231ps_fma(auVar62,auVar100,auVar13);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar14),_DAT_01f7b000);
          auVar168._0_4_ = auVar13._0_4_ * auVar124._0_4_;
          auVar168._4_4_ = auVar13._4_4_ * auVar124._4_4_;
          auVar168._8_4_ = auVar13._8_4_ * auVar124._8_4_;
          auVar168._12_4_ = auVar13._12_4_ * auVar124._12_4_;
          auVar168._16_4_ = auVar13._16_4_ * auVar124._16_4_;
          auVar168._20_4_ = auVar13._20_4_ * auVar124._20_4_;
          auVar168._24_4_ = auVar13._24_4_ * auVar124._24_4_;
          auVar168._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar168,auVar20,auVar18);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar169._0_4_ = auVar103._0_4_ * auVar108._0_4_;
          auVar169._4_4_ = auVar103._4_4_ * auVar108._4_4_;
          auVar169._8_4_ = auVar103._8_4_ * auVar108._8_4_;
          auVar169._12_4_ = auVar103._12_4_ * auVar108._12_4_;
          auVar169._16_4_ = auVar103._16_4_ * auVar108._16_4_;
          auVar169._20_4_ = auVar103._20_4_ * auVar108._20_4_;
          auVar169._24_4_ = auVar103._24_4_ * auVar108._24_4_;
          auVar169._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar169,auVar19,auVar6);
          auVar63._4_4_ = auVar101._4_4_ * auVar6._4_4_;
          auVar63._0_4_ = auVar101._0_4_ * auVar6._0_4_;
          auVar63._8_4_ = auVar101._8_4_ * auVar6._8_4_;
          auVar63._12_4_ = auVar101._12_4_ * auVar6._12_4_;
          auVar63._16_4_ = auVar101._16_4_ * auVar6._16_4_;
          auVar63._20_4_ = auVar101._20_4_ * auVar6._20_4_;
          auVar63._24_4_ = auVar101._24_4_ * auVar6._24_4_;
          auVar63._28_4_ = auVar6._28_4_;
          auVar16 = vfmsub231ps_fma(auVar63,auVar129,auVar103);
          auVar64._4_4_ = auVar19._4_4_ * auVar129._4_4_;
          auVar64._0_4_ = auVar19._0_4_ * auVar129._0_4_;
          auVar64._8_4_ = auVar19._8_4_ * auVar129._8_4_;
          auVar64._12_4_ = auVar19._12_4_ * auVar129._12_4_;
          auVar64._16_4_ = auVar19._16_4_ * auVar129._16_4_;
          auVar64._20_4_ = auVar19._20_4_ * auVar129._20_4_;
          auVar64._24_4_ = auVar19._24_4_ * auVar129._24_4_;
          auVar64._28_4_ = auVar129._28_4_;
          auVar97 = vfmsub231ps_fma(auVar64,auVar101,auVar108);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar108 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
          auVar108 = vcmpps_avx(auVar108,ZEXT832(0) << 0x20,2);
          auVar14 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
          auVar11 = vpand_avx(auVar14,auVar11);
          auVar108 = vpmovsxwd_avx2(auVar11);
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0x7f,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0xbf,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar108[0x1f]) {
LAB_01156869:
            auVar150._8_8_ = uStack_618;
            auVar150._0_8_ = local_620;
            auVar150._16_8_ = uStack_610;
            auVar150._24_8_ = uStack_608;
            auVar100 = vpcmpeqd_avx2(auVar166,auVar166);
            auVar192 = ZEXT3264(auVar100);
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar195 = ZEXT3264(auVar102);
          }
          else {
            auVar65._4_4_ = auVar13._4_4_ * auVar103._4_4_;
            auVar65._0_4_ = auVar13._0_4_ * auVar103._0_4_;
            auVar65._8_4_ = auVar13._8_4_ * auVar103._8_4_;
            auVar65._12_4_ = auVar13._12_4_ * auVar103._12_4_;
            auVar65._16_4_ = auVar13._16_4_ * auVar103._16_4_;
            auVar65._20_4_ = auVar13._20_4_ * auVar103._20_4_;
            auVar65._24_4_ = auVar13._24_4_ * auVar103._24_4_;
            auVar65._28_4_ = auVar108._28_4_;
            auVar134 = vfmsub231ps_fma(auVar65,auVar101,auVar18);
            auVar173._0_4_ = auVar18._0_4_ * auVar19._0_4_;
            auVar173._4_4_ = auVar18._4_4_ * auVar19._4_4_;
            auVar173._8_4_ = auVar18._8_4_ * auVar19._8_4_;
            auVar173._12_4_ = auVar18._12_4_ * auVar19._12_4_;
            auVar173._16_4_ = auVar18._16_4_ * auVar19._16_4_;
            auVar173._20_4_ = auVar18._20_4_ * auVar19._20_4_;
            auVar173._24_4_ = auVar18._24_4_ * auVar19._24_4_;
            auVar173._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar173,auVar166,auVar103);
            auVar66._4_4_ = auVar166._4_4_ * auVar101._4_4_;
            auVar66._0_4_ = auVar166._0_4_ * auVar101._0_4_;
            auVar66._8_4_ = auVar166._8_4_ * auVar101._8_4_;
            auVar66._12_4_ = auVar166._12_4_ * auVar101._12_4_;
            auVar66._16_4_ = auVar166._16_4_ * auVar101._16_4_;
            auVar66._20_4_ = auVar166._20_4_ * auVar101._20_4_;
            auVar66._24_4_ = auVar166._24_4_ * auVar101._24_4_;
            auVar66._28_4_ = auVar101._28_4_;
            auVar121 = vfmsub231ps_fma(auVar66,auVar19,auVar13);
            auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar96),ZEXT1632(auVar121));
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar134),ZEXT832(0) << 0x20);
            auVar166 = ZEXT1632(auVar97);
            auVar108 = vrcpps_avx(ZEXT1632(auVar97));
            auVar199._8_4_ = 0x3f800000;
            auVar199._0_8_ = 0x3f8000003f800000;
            auVar199._12_4_ = 0x3f800000;
            auVar199._16_4_ = 0x3f800000;
            auVar199._20_4_ = 0x3f800000;
            auVar199._24_4_ = 0x3f800000;
            auVar199._28_4_ = 0x3f800000;
            auVar14 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar97),auVar199);
            auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar108,auVar108);
            auVar148._0_4_ = auVar121._0_4_ * auVar124._0_4_;
            auVar148._4_4_ = auVar121._4_4_ * auVar124._4_4_;
            auVar148._8_4_ = auVar121._8_4_ * auVar124._8_4_;
            auVar148._12_4_ = auVar121._12_4_ * auVar124._12_4_;
            auVar148._16_4_ = auVar124._16_4_ * 0.0;
            auVar148._20_4_ = auVar124._20_4_ * 0.0;
            auVar148._24_4_ = auVar124._24_4_ * 0.0;
            auVar148._28_4_ = 0;
            auVar96 = vfmadd231ps_fma(auVar148,ZEXT1632(auVar96),auVar20);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar100,ZEXT1632(auVar134));
            fVar133 = auVar14._0_4_;
            fVar132 = auVar14._4_4_;
            fVar112 = auVar14._8_4_;
            fVar114 = auVar14._12_4_;
            auVar124 = ZEXT1632(CONCAT412(fVar114 * auVar96._12_4_,
                                          CONCAT48(fVar112 * auVar96._8_4_,
                                                   CONCAT44(fVar132 * auVar96._4_4_,
                                                            fVar133 * auVar96._0_4_))));
            uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar149._4_4_ = uVar91;
            auVar149._0_4_ = uVar91;
            auVar149._8_4_ = uVar91;
            auVar149._12_4_ = uVar91;
            auVar149._16_4_ = uVar91;
            auVar149._20_4_ = uVar91;
            auVar149._24_4_ = uVar91;
            auVar149._28_4_ = uVar91;
            auVar76._4_4_ = uStack_dc;
            auVar76._0_4_ = local_e0;
            auVar76._8_4_ = uStack_d8;
            auVar76._12_4_ = uStack_d4;
            auVar76._16_4_ = uStack_d0;
            auVar76._20_4_ = uStack_cc;
            auVar76._24_4_ = uStack_c8;
            auVar76._28_4_ = uStack_c4;
            auVar100 = vcmpps_avx(auVar76,auVar124,2);
            auVar20 = vcmpps_avx(auVar124,auVar149,2);
            auVar100 = vandps_avx(auVar20,auVar100);
            auVar14 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar11 = vpand_avx(auVar11,auVar14);
            auVar100 = vpmovsxwd_avx2(auVar11);
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0x7f,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar100 >> 0xbf,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar100[0x1f]) goto LAB_01156869;
            auVar100 = vcmpps_avx(ZEXT1632(auVar97),ZEXT832(0) << 0x20,4);
            auVar97 = auVar100._16_16_;
            auVar14 = vpackssdw_avx(auVar100._0_16_,auVar97);
            auVar11 = vpand_avx(auVar11,auVar14);
            auVar20 = vpmovsxwd_avx2(auVar11);
            auVar150._8_8_ = uStack_618;
            auVar150._0_8_ = local_620;
            auVar150._16_8_ = uStack_610;
            auVar150._24_8_ = uStack_608;
            auVar100 = vpcmpeqd_avx2(ZEXT1632(auVar97),ZEXT1632(auVar97));
            auVar192 = ZEXT3264(auVar100);
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar195 = ZEXT3264(auVar102);
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar108 = ZEXT1632(CONCAT412(fVar114 * auVar15._12_4_,
                                            CONCAT48(fVar112 * auVar15._8_4_,
                                                     CONCAT44(fVar132 * auVar15._4_4_,
                                                              fVar133 * auVar15._0_4_))));
              auVar67._28_4_ = SUB84(uStack_608,4);
              auVar67._0_28_ =
                   ZEXT1628(CONCAT412(fVar114 * auVar16._12_4_,
                                      CONCAT48(fVar112 * auVar16._8_4_,
                                               CONCAT44(fVar132 * auVar16._4_4_,
                                                        fVar133 * auVar16._0_4_))));
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = 0x3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar182._16_4_ = 0x3f800000;
              auVar182._20_4_ = 0x3f800000;
              auVar182._24_4_ = 0x3f800000;
              auVar182._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar182,auVar108);
              auVar100 = vblendvps_avx(auVar100,auVar108,auVar10);
              auVar197 = ZEXT3264(auVar100);
              auVar100 = vsubps_avx(auVar182,auVar67);
              local_540 = vblendvps_avx(auVar100,auVar67,auVar10);
              auVar195 = ZEXT3264(auVar124);
              auVar150 = auVar20;
            }
          }
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0x7f,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0xbf,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar150[0x1f] < '\0') {
            auVar100 = vsubps_avx(auVar125,auVar201);
            auVar108 = auVar197._0_32_;
            auVar11 = vfmadd213ps_fma(auVar100,auVar108,auVar201);
            fVar133 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar68._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar133;
            auVar68._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar133;
            auVar68._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar133;
            auVar68._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar133;
            auVar68._16_4_ = fVar133 * 0.0;
            auVar68._20_4_ = fVar133 * 0.0;
            auVar68._24_4_ = fVar133 * 0.0;
            auVar68._28_4_ = fVar133;
            auVar124 = auVar195._0_32_;
            auVar100 = vcmpps_avx(auVar124,auVar68,6);
            auVar20 = auVar150 & auVar100;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar144._8_4_ = 0x40000000;
              auVar144._0_8_ = 0x4000000040000000;
              auVar144._12_4_ = 0x40000000;
              auVar144._16_4_ = 0x40000000;
              auVar144._20_4_ = 0x40000000;
              auVar144._24_4_ = 0x40000000;
              auVar144._28_4_ = 0x40000000;
              auVar11 = vfmadd213ps_fma(local_540,auVar144,auVar131);
              local_360 = ZEXT1632(auVar11);
              local_310 = local_6b0._0_8_;
              uStack_308 = local_6b0._8_8_;
              local_300 = local_730;
              uStack_2f8 = uStack_728;
              local_2f0 = local_740;
              uStack_2e8 = uStack_738;
              pGVar8 = (context->scene->geometries).items[uVar86].ptr;
              local_540 = local_360;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar84 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar84 = context->args;
                if ((pRVar84->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar84 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar84 >> 8),1),
                   pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar100 = vandps_avx(auVar100,auVar150);
                  fVar133 = (float)local_320;
                  local_2a0[0] = (fVar133 + auVar197._0_4_ + 0.0) * local_120;
                  local_2a0[1] = (fVar133 + auVar197._4_4_ + 1.0) * fStack_11c;
                  local_2a0[2] = (fVar133 + auVar197._8_4_ + 2.0) * fStack_118;
                  local_2a0[3] = (fVar133 + auVar197._12_4_ + 3.0) * fStack_114;
                  fStack_290 = (fVar133 + auVar197._16_4_ + 4.0) * fStack_110;
                  fStack_28c = (fVar133 + auVar197._20_4_ + 5.0) * fStack_10c;
                  fStack_288 = (fVar133 + auVar197._24_4_ + 6.0) * fStack_108;
                  fStack_284 = fVar133 + auVar197._28_4_ + 7.0;
                  local_540._0_8_ = auVar11._0_8_;
                  local_540._8_8_ = auVar11._8_8_;
                  local_280 = local_540._0_8_;
                  uStack_278 = local_540._8_8_;
                  uStack_270 = 0;
                  uStack_268 = 0;
                  local_260 = auVar124;
                  uVar91 = vmovmskps_avx(auVar100);
                  uVar83 = 0;
                  uVar85 = CONCAT44((int)((ulong)pRVar84 >> 0x20),uVar91);
                  for (uVar21 = uVar85; local_380 = auVar108, local_340 = auVar124,
                      local_31c = iVar81, (uVar21 & 1) == 0;
                      uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                    uVar83 = uVar83 + 1;
                  }
                  while (auVar100 = auVar192._0_32_, uVar85 != 0) {
                    uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1e0 = local_2a0[uVar83];
                    local_1c0 = *(undefined4 *)((long)&local_280 + uVar83 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar83 * 4);
                    fVar112 = 1.0 - local_1e0;
                    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                              ZEXT416((uint)(local_1e0 * fVar112)),
                                              ZEXT416(0xc0000000));
                    auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar112)),
                                              ZEXT416((uint)(local_1e0 * local_1e0)),
                                              ZEXT416(0x40000000));
                    fVar133 = auVar11._0_4_ * 3.0;
                    fVar132 = local_1e0 * local_1e0 * 3.0;
                    auVar163._0_4_ = fVar132 * (float)local_5b0._0_4_;
                    auVar163._4_4_ = fVar132 * (float)local_5b0._4_4_;
                    auVar163._8_4_ = fVar132 * fStack_5a8;
                    auVar163._12_4_ = fVar132 * fStack_5a4;
                    auVar138._4_4_ = fVar133;
                    auVar138._0_4_ = fVar133;
                    auVar138._8_4_ = fVar133;
                    auVar138._12_4_ = fVar133;
                    auVar11 = vfmadd132ps_fma(auVar138,auVar163,auVar17);
                    fVar133 = auVar14._0_4_ * 3.0;
                    auVar154._4_4_ = fVar133;
                    auVar154._0_4_ = fVar133;
                    auVar154._8_4_ = fVar133;
                    auVar154._12_4_ = fVar133;
                    auVar11 = vfmadd132ps_fma(auVar154,auVar11,auVar122);
                    fVar133 = fVar112 * fVar112 * -3.0;
                    local_710.context = context->user;
                    auVar139._4_4_ = fVar133;
                    auVar139._0_4_ = fVar133;
                    auVar139._8_4_ = fVar133;
                    auVar139._12_4_ = fVar133;
                    auVar14 = vfmadd132ps_fma(auVar139,auVar11,local_6b0);
                    local_240 = auVar14._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar11 = vmovshdup_avx(auVar14);
                    local_220 = auVar11._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar11 = vshufps_avx(auVar14,auVar14,0xaa);
                    local_200 = auVar11._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_5a0._0_8_;
                    uStack_198 = local_5a0._8_8_;
                    uStack_190 = CONCAT44(uStack_58c,uStack_590);
                    uStack_188 = CONCAT44(uStack_584,uStack_588);
                    local_180 = CONCAT44(uStack_fc,local_100);
                    uStack_178 = CONCAT44(uStack_f4,uStack_f8);
                    uStack_170 = CONCAT44(uStack_ec,uStack_f0);
                    uStack_168 = CONCAT44(uStack_e4,uStack_e8);
                    local_160 = (local_710.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_710.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_660 = local_420;
                    local_710.valid = (int *)local_660;
                    local_710.geometryUserPtr = pGVar8->userPtr;
                    local_710.hit = (RTCHitN *)&local_240;
                    local_710.N = 8;
                    local_710.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar100 = ZEXT1632(auVar192._0_16_);
                      (*pGVar8->occlusionFilterN)(&local_710);
                    }
                    auVar20 = vpcmpeqd_avx2(local_660,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar129 = vpcmpeqd_avx2(auVar100,auVar100);
                    auVar100 = auVar129 & ~auVar20;
                    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar100 >> 0x7f,0) == '\0') &&
                          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar100 >> 0xbf,0) == '\0') &&
                        (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar100[0x1f]) {
                      auVar20 = auVar129 ^ auVar20;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar129 = ZEXT1632(auVar129._0_16_);
                        (*p_Var9)(&local_710);
                      }
                      auVar100 = vpcmpeqd_avx2(local_660,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
                      ;
                      auVar129 = vpcmpeqd_avx2(auVar129,auVar129);
                      auVar20 = auVar129 ^ auVar100;
                      auVar145._8_4_ = 0xff800000;
                      auVar145._0_8_ = 0xff800000ff800000;
                      auVar145._12_4_ = 0xff800000;
                      auVar145._16_4_ = 0xff800000;
                      auVar145._20_4_ = 0xff800000;
                      auVar145._24_4_ = 0xff800000;
                      auVar145._28_4_ = 0xff800000;
                      auVar100 = vblendvps_avx(auVar145,*(undefined1 (*) [32])
                                                         (local_710.ray + 0x100),auVar100);
                      *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar100;
                    }
                    auVar192 = ZEXT3264(auVar129);
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0xbf,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar20[0x1f] < '\0') {
                      pRVar84 = (RTCIntersectArguments *)0x1;
                      goto LAB_011568a6;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar91;
                    uVar21 = uVar83 & 0x3f;
                    uVar83 = 0;
                    uVar85 = uVar85 ^ 1L << uVar21;
                    for (uVar21 = uVar85; (uVar21 & 1) == 0;
                        uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                      uVar83 = uVar83 + 1;
                    }
                  }
                  pRVar84 = (RTCIntersectArguments *)0x0;
LAB_011568a6:
                  auVar197 = ZEXT3264(auVar108);
                  auVar195 = ZEXT3264(auVar124);
                }
              }
              p_Var90 = (RTCFilterFunctionN)(ulong)(byte)((byte)p_Var90 | (byte)pRVar84);
            }
          }
        }
      }
    }
    if (((ulong)p_Var90 & 1) != 0) break;
    uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar99._4_4_ = uVar91;
    auVar99._0_4_ = uVar91;
    auVar99._8_4_ = uVar91;
    auVar99._12_4_ = uVar91;
    auVar11 = vcmpps_avx(local_440,auVar99,2);
    uVar86 = vmovmskps_avx(auVar11);
  }
  return uVar82 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }